

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  int iVar1;
  BVH *bvh;
  Ref<embree::Geometry> *pRVar2;
  Geometry *pGVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  undefined8 uVar21;
  vfloat<4> vVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  bool bVar25;
  uint uVar26;
  undefined4 uVar27;
  int iVar28;
  AABBNodeMB4D *node1;
  undefined1 *puVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  GridSOA *pGVar33;
  RTCIntersectArguments *pRVar34;
  uint uVar35;
  long lVar36;
  RTCIntersectArguments *pRVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  RTCIntersectArguments *pRVar41;
  long lVar42;
  size_t sVar43;
  long lVar44;
  GridSOA *pGVar45;
  GridSOA *pGVar46;
  ulong uVar47;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar48;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar49;
  ulong uVar50;
  long lVar51;
  Primitive_conflict3 *prim;
  NodeRef root;
  ulong uVar52;
  float fVar53;
  float fVar77;
  float fVar79;
  vint4 ai;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar80;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar78;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar81 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar104;
  float fVar105;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar106;
  float fVar107;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar108;
  float fVar109;
  float fVar114;
  float fVar117;
  vint4 ai_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar122;
  float fVar123;
  float fVar129;
  float fVar131;
  vint4 ai_3;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar136;
  float fVar140;
  float fVar141;
  vint4 bi;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar147;
  float fVar148;
  vint4 bi_3;
  float fVar149;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar150;
  float fVar161;
  float fVar164;
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar151;
  float fVar152;
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar168;
  float fVar169;
  uint uVar170;
  float fVar176;
  float fVar179;
  vint4 ai_2;
  float fVar177;
  uint uVar178;
  uint uVar180;
  float fVar181;
  float fVar182;
  uint uVar183;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  uint uVar184;
  uint uVar185;
  float fVar186;
  float fVar187;
  uint uVar188;
  uint uVar189;
  float fVar190;
  float fVar191;
  uint uVar192;
  uint uVar193;
  float fVar194;
  vint4 bi_2;
  uint uVar195;
  uint uVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar216;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float local_1c88;
  float fStack_1c84;
  float fStack_1c80;
  float fStack_1c7c;
  undefined8 uStack_1c70;
  undefined8 uStack_1c40;
  undefined1 local_1c38 [8];
  float fStack_1c30;
  float fStack_1c2c;
  float local_1c28;
  float fStack_1c24;
  float fStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  RTCFilterFunctionNArguments args;
  GridSOA *local_1b80;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined1 local_1b38 [16];
  NodeRef *local_1b20;
  GridSOA *local_1b18;
  OccludedFunc16 local_1b10;
  GridSOA *local_1b08;
  GridSOA *local_1b00;
  GridSOA *local_1af8;
  GridSOA *local_1af0;
  GridSOA *local_1ae8;
  GridSOA *local_1ae0;
  undefined1 local_1ad8 [8];
  float fStack_1ad0;
  float fStack_1acc;
  float local_1ac8;
  float fStack_1ac4;
  float fStack_1ac0;
  float fStack_1abc;
  vbool<4> terminated;
  Precalculations pre;
  GridSOA *local_1a80;
  GridSOA *local_1a78;
  GridSOA *local_1a70;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1a48;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  undefined1 local_19e8 [16];
  RTCIntersectArguments local_19d8;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  vint<4> vitime;
  Vec3vf<4> Ng;
  TravRayK<4,_false> tray;
  uint local_17f8;
  uint uStack_17f4;
  uint uStack_17f0;
  uint uStack_17ec;
  uint local_17e8;
  uint uStack_17e4;
  uint uStack_17e0;
  uint uStack_17dc;
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float fStack_179c;
  char *local_1798;
  IntersectFunc8 p_Stack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined1 local_1768 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1758;
  undefined1 local_1748 [16];
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar155 [16];
  
  uVar24 = mm_lookupmask_ps._8_8_;
  uVar23 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar156._8_4_ = 0xffffffff;
    auVar156._0_8_ = 0xffffffffffffffff;
    auVar156._12_4_ = 0xffffffff;
    auVar110 = *(undefined1 (*) [16])(ray + 0x80);
    auVar218._0_12_ = ZEXT812(0);
    auVar218._12_4_ = 0;
    uVar184 = -(uint)(0.0 <= auVar110._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar188 = -(uint)(0.0 <= auVar110._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar192 = -(uint)(0.0 <= auVar110._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar195 = -(uint)(0.0 <= auVar110._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar55._4_4_ = uVar188;
    auVar55._0_4_ = uVar184;
    auVar55._8_4_ = uVar192;
    auVar55._12_4_ = uVar195;
    uVar35 = movmskps((int)context,auVar55);
    pRVar37 = (RTCIntersectArguments *)(ulong)uVar35;
    if (uVar35 != 0) {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar168 = (float)DAT_01f4bd50;
      fVar176 = DAT_01f4bd50._4_4_;
      fVar179 = DAT_01f4bd50._8_4_;
      fVar181 = DAT_01f4bd50._12_4_;
      auVar81._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar176);
      auVar81._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar168);
      auVar81._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar179);
      auVar81._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar181);
      auVar153 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar81
                         );
      auVar137._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar176);
      auVar137._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar168);
      auVar137._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar179);
      auVar137._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar181);
      auVar81 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar137
                        );
      auVar54._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar176);
      auVar54._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar168);
      auVar54._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar179);
      auVar54._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar181);
      auVar137 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar54
                         );
      auVar55 = rcpps(auVar54,auVar153);
      fVar168 = auVar55._0_4_;
      auVar154._0_4_ = auVar153._0_4_ * fVar168;
      fVar176 = auVar55._4_4_;
      auVar154._4_4_ = auVar153._4_4_ * fVar176;
      fVar179 = auVar55._8_4_;
      auVar154._8_4_ = auVar153._8_4_ * fVar179;
      fVar181 = auVar55._12_4_;
      auVar154._12_4_ = auVar153._12_4_ * fVar181;
      fVar169 = (float)DAT_01f46a60;
      fVar177 = DAT_01f46a60._4_4_;
      fVar182 = DAT_01f46a60._12_4_;
      fVar80 = DAT_01f46a60._8_4_;
      tray.rdir.field_0._0_4_ = (fVar169 - auVar154._0_4_) * fVar168 + fVar168;
      tray.rdir.field_0._4_4_ = (fVar177 - auVar154._4_4_) * fVar176 + fVar176;
      tray.rdir.field_0._8_4_ = (fVar80 - auVar154._8_4_) * fVar179 + fVar179;
      tray.rdir.field_0._12_4_ = (fVar182 - auVar154._12_4_) * fVar181 + fVar181;
      auVar55 = rcpps(auVar154,auVar81);
      fVar168 = auVar55._0_4_;
      fVar176 = auVar55._4_4_;
      fVar179 = auVar55._8_4_;
      fVar181 = auVar55._12_4_;
      tray.rdir.field_0._16_4_ = (fVar169 - auVar81._0_4_ * fVar168) * fVar168 + fVar168;
      tray.rdir.field_0._20_4_ = (fVar177 - auVar81._4_4_ * fVar176) * fVar176 + fVar176;
      tray.rdir.field_0._24_4_ = (fVar80 - auVar81._8_4_ * fVar179) * fVar179 + fVar179;
      tray.rdir.field_0._28_4_ = (fVar182 - auVar81._12_4_ * fVar181) * fVar181 + fVar181;
      auVar55 = rcpps(auVar55,auVar137);
      fVar168 = auVar55._0_4_;
      fVar176 = auVar55._4_4_;
      fVar179 = auVar55._8_4_;
      fVar181 = auVar55._12_4_;
      tray.rdir.field_0._32_4_ = (fVar169 - auVar137._0_4_ * fVar168) * fVar168 + fVar168;
      tray.rdir.field_0._36_4_ = (fVar177 - auVar137._4_4_ * fVar176) * fVar176 + fVar176;
      tray.rdir.field_0._40_4_ = (fVar80 - auVar137._8_4_ * fVar179) * fVar179 + fVar179;
      tray.rdir.field_0._44_4_ = (fVar182 - auVar137._12_4_ * fVar181) * fVar181 + fVar181;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)((float)tray.rdir.field_0._4_4_ < 0.0),
                    -(uint)((float)tray.rdir.field_0._0_4_ < 0.0)) & 0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar153._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar153._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar153._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar153._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar153);
      auVar56._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar56._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar56._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar56._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar56);
      auVar55 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar218);
      fVar168 = (float)DAT_01f45a30;
      fVar176 = DAT_01f45a30._4_4_;
      fVar179 = DAT_01f45a30._8_4_;
      fVar181 = DAT_01f45a30._12_4_;
      auVar57._4_4_ = uVar188;
      auVar57._0_4_ = uVar184;
      auVar57._8_4_ = uVar192;
      auVar57._12_4_ = uVar195;
      aVar82.v = (__m128)blendvps(_DAT_01f45a30,auVar55,auVar57);
      auVar110 = maxps(auVar110,auVar218);
      tray.tnear.field_0 = aVar82;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar110,auVar57);
      auVar110._4_4_ = uVar188;
      auVar110._0_4_ = uVar184;
      auVar110._8_4_ = uVar192;
      auVar110._12_4_ = uVar195;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar156 ^ auVar110);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 3;
      }
      else {
        pRVar37 = (RTCIntersectArguments *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar35 = ((char)pRVar37 == '\0') + 2;
      }
      local_1b20 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = aVar82;
      puVar29 = mm_lookupmask_ps;
      paVar49 = &stack_near[2].field_0;
LAB_006d74bf:
      do {
        do {
          root.ptr = local_1b20[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006d930b;
          local_1b20 = local_1b20 + -1;
          paVar48 = paVar49 + -1;
          local_1c38._0_4_ = paVar48->v[0];
          local_1c38._4_4_ = *(float *)((long)paVar49 + -0xc);
          fStack_1c30 = *(float *)((long)paVar49 + -8);
          fStack_1c2c = *(float *)((long)paVar49 + -4);
          vVar22.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar48->v;
          auVar58._4_4_ = -(uint)((float)local_1c38._4_4_ < tray.tfar.field_0.v[1]);
          auVar58._0_4_ = -(uint)((float)local_1c38._0_4_ < tray.tfar.field_0.v[0]);
          auVar58._8_4_ = -(uint)(fStack_1c30 < tray.tfar.field_0.v[2]);
          auVar58._12_4_ = -(uint)(fStack_1c2c < tray.tfar.field_0.v[3]);
          uVar26 = movmskps((int)puVar29,auVar58);
          puVar29 = (undefined1 *)(ulong)uVar26;
          paVar49 = paVar48;
        } while (uVar26 == 0);
        uVar30 = (ulong)(byte)uVar26;
        if (uVar35 < (uint)POPCOUNT(uVar26 & 0xff)) {
LAB_006d7505:
          do {
            lVar38 = -0x10;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006d930b;
              auVar61._4_4_ = -(uint)((float)local_1c38._4_4_ < tray.tfar.field_0.v[1]);
              auVar61._0_4_ = -(uint)((float)local_1c38._0_4_ < tray.tfar.field_0.v[0]);
              auVar61._8_4_ = -(uint)(fStack_1c30 < tray.tfar.field_0.v[2]);
              auVar61._12_4_ = -(uint)(fStack_1c2c < tray.tfar.field_0.v[3]);
              uVar26 = movmskps((int)puVar29,auVar61);
              puVar29 = (undefined1 *)(ulong)uVar26;
              if (uVar26 != 0) {
                if (((uint)root.ptr & 0xf) == 8) {
                  auVar99._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  auVar99._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
                  auVar99._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
                  uVar30 = (ulong)(*(int *)(pre.super_Precalculations.grid + 8) - 1);
                  fVar80 = (float)uVar30;
                  auVar111._0_4_ = fVar80 * *(float *)(ray + 0x70);
                  auVar111._4_4_ = fVar80 * *(float *)(ray + 0x74);
                  auVar111._8_4_ = fVar80 * *(float *)(ray + 0x78);
                  auVar111._12_4_ = fVar80 * *(float *)(ray + 0x7c);
                  auVar110 = roundps((undefined1  [16])aVar82,auVar111,1);
                  auVar62._0_4_ = fVar80 + -1.0;
                  auVar62._4_4_ = auVar62._0_4_;
                  auVar62._8_4_ = auVar62._0_4_;
                  auVar62._12_4_ = auVar62._0_4_;
                  auVar110 = minps(auVar110,auVar62);
                  auVar110 = maxps(auVar110,_DAT_01f45a50);
                  fVar142 = auVar111._0_4_ - auVar110._0_4_;
                  fVar122 = auVar111._4_4_ - auVar110._4_4_;
                  fVar133 = auVar111._8_4_ - auVar110._8_4_;
                  fVar136 = auVar111._12_4_ - auVar110._12_4_;
                  auVar83._8_4_ = auVar99._8_4_;
                  auVar83._0_8_ = auVar99._0_8_;
                  auVar83._12_4_ = auVar99._12_4_;
                  vitime.field_0.i[0] = (int)auVar110._0_4_;
                  vitime.field_0.i[1] = (int)auVar110._4_4_;
                  vitime.field_0.i[2] = (int)auVar110._8_4_;
                  vitime.field_0.i[3] = (int)auVar110._12_4_;
                  fVar80 = 1.0 - fVar142;
                  fVar169 = 1.0 - fVar122;
                  fVar177 = 1.0 - fVar133;
                  fVar182 = 1.0 - fVar136;
                  uVar52 = root.ptr >> 2 & 0xfffffffffffffffc;
                  while( true ) {
                    uVar26 = movmskps((int)uVar30,auVar83);
                    if (uVar26 == 0) break;
                    lVar38 = 0;
                    if ((uVar26 & 0xff) != 0) {
                      for (; ((uVar26 & 0xff) >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                      }
                    }
                    iVar28 = vitime.field_0.i[(int)lVar38];
                    uVar47 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                    uVar31 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc);
                    lVar44 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x28) * (long)iVar28;
                    iVar1 = *(int *)(pre.super_Precalculations.grid + 0x10);
                    uVar30 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                    uVar50 = (ulong)(*(uint *)(pre.super_Precalculations.grid + 0x28) & 0xfffffffc);
                    lVar36 = uVar50 + uVar30 + lVar44;
                    lVar39 = uVar47 * 0xc + lVar36;
                    local_1b18 = pre.super_Precalculations.grid + lVar39 + uVar31 * 4 + uVar52;
                    lVar40 = lVar44 + uVar47 * 8 + uVar30;
                    lVar51 = uVar50 + lVar40;
                    local_1ae0 = pre.super_Precalculations.grid + lVar51 + uVar31 * 4 + uVar52;
                    lVar38 = lVar36 + uVar47 * 4;
                    local_1ae8 = pre.super_Precalculations.grid + lVar38 + uVar31 * 4 + uVar52;
                    local_1af0 = pre.super_Precalculations.grid + lVar36 + uVar31 * 4 + uVar52;
                    lVar42 = uVar52 + 0x30;
                    local_1af8 = pre.super_Precalculations.grid +
                                 uVar30 + lVar44 + uVar31 * 4 + lVar42;
                    local_1b00 = pre.super_Precalculations.grid + lVar40 + uVar31 * 4 + lVar42;
                    lVar32 = lVar44 + uVar47 * 4 + uVar30;
                    local_1b08 = pre.super_Precalculations.grid + lVar32 + uVar31 * 4 + lVar42;
                    local_1b80 = pre.super_Precalculations.grid + lVar39 + lVar42;
                    pGVar45 = pre.super_Precalculations.grid + lVar51 + lVar42;
                    local_1a78 = pre.super_Precalculations.grid + lVar38 + lVar42;
                    pRVar37 = (RTCIntersectArguments *)
                              (pre.super_Precalculations.grid + lVar36 + lVar42);
                    local_1a70 = pre.super_Precalculations.grid + lVar40 + lVar42;
                    local_1a80 = pre.super_Precalculations.grid + lVar32 + lVar42;
                    pGVar46 = pre.super_Precalculations.grid + lVar44;
                    auVar63._0_4_ = -(uint)(iVar28 == vitime.field_0.i[0]);
                    auVar63._4_4_ = -(uint)(iVar28 == vitime.field_0.i[1]);
                    auVar63._8_4_ = -(uint)(iVar28 == vitime.field_0.i[2]);
                    auVar63._12_4_ = -(uint)(iVar28 == vitime.field_0.i[3]);
                    auVar63 = auVar63 & auVar83;
                    auVar110 = auVar63 ^ _DAT_01f46b70;
                    lVar38 = uVar31 * 4;
                    local_1b10 = (OccludedFunc16)(uVar30 + 0x2c);
                    uVar30 = 0;
                    pRVar41 = pRVar37;
                    _local_1c38 = auVar63;
                    while (valid_i = (vint<4> *)&args, uVar30 != (ulong)(iVar1 != 2) + 1) {
                      uVar30 = uVar30 + 1;
                      pGVar33 = pGVar46 + uVar52 + (long)local_1b10;
                      lVar42 = 0;
                      do {
                        if ((ulong)(uVar31 != 2) * 4 + 4 == lVar42) break;
                        fVar168 = *(float *)(pGVar33 + lVar42);
                        fVar176 = *(float *)(pGVar33 + lVar42 + 4);
                        fVar179 = *(float *)(local_1a80 + lVar42 + -4);
                        fVar181 = *(float *)(local_1a80 + lVar42);
                        fVar147 = *(float *)(local_1a70 + lVar42 + -4);
                        fVar148 = *(float *)(local_1a70 + lVar42);
                        fVar149 = *(float *)(local_1af8 + lVar42 + -4);
                        fVar96 = *(float *)(local_1b08 + lVar42 + -4);
                        fVar104 = *(float *)(local_1b00 + lVar42 + -4);
                        fVar135 = *(float *)((long)pRVar41 + lVar42 + -4);
                        fVar106 = *(float *)((long)&pRVar41->flags + lVar42);
                        fVar78 = *(float *)(local_1a78 + lVar42 + -4);
                        fVar53 = *(float *)(local_1a78 + lVar42);
                        fVar77 = *(float *)(pGVar45 + lVar42 + -4);
                        fVar79 = *(float *)(pGVar45 + lVar42);
                        fVar114 = *(float *)(local_1af0 + lVar42 + 0x2c);
                        fVar117 = *(float *)(local_1ae8 + lVar42 + 0x2c);
                        fVar129 = *(float *)(local_1ae0 + lVar42 + 0x2c);
                        local_1ac8 = fVar176 * fVar80 + fVar106 * fVar142;
                        fStack_1ac4 = fVar176 * fVar169 + fVar106 * fVar122;
                        fStack_1ac0 = fVar176 * fVar177 + fVar106 * fVar133;
                        fStack_1abc = fVar176 * fVar182 + fVar106 * fVar136;
                        fVar150 = fVar181 * fVar80 + fVar53 * fVar142;
                        fVar161 = fVar181 * fVar169 + fVar53 * fVar122;
                        fVar164 = fVar181 * fVar177 + fVar53 * fVar133;
                        fVar166 = fVar181 * fVar182 + fVar53 * fVar136;
                        fVar243 = fVar148 * fVar80 + fVar79 * fVar142;
                        fVar246 = fVar148 * fVar169 + fVar79 * fVar122;
                        fVar249 = fVar148 * fVar177 + fVar79 * fVar133;
                        fVar252 = fVar148 * fVar182 + fVar79 * fVar136;
                        fVar186 = fVar149 * fVar80 + fVar114 * fVar142;
                        fVar190 = fVar149 * fVar169 + fVar114 * fVar122;
                        fVar194 = fVar149 * fVar177 + fVar114 * fVar133;
                        fVar197 = fVar149 * fVar182 + fVar114 * fVar136;
                        fVar198 = fVar96 * fVar80 + fVar117 * fVar142;
                        fVar206 = fVar96 * fVar169 + fVar117 * fVar122;
                        fVar209 = fVar96 * fVar177 + fVar117 * fVar133;
                        fVar213 = fVar96 * fVar182 + fVar117 * fVar136;
                        fVar223 = fVar104 * fVar80 + fVar129 * fVar142;
                        fVar226 = fVar104 * fVar169 + fVar129 * fVar122;
                        fVar229 = fVar104 * fVar177 + fVar129 * fVar133;
                        fVar232 = fVar104 * fVar182 + fVar129 * fVar136;
                        fVar176 = *(float *)ray;
                        fVar181 = *(float *)(ray + 4);
                        fVar148 = *(float *)(ray + 8);
                        fVar149 = *(float *)(ray + 0xc);
                        fVar96 = *(float *)(ray + 0x10);
                        fVar104 = *(float *)(ray + 0x14);
                        fVar106 = *(float *)(ray + 0x18);
                        fVar53 = *(float *)(ray + 0x1c);
                        fVar79 = *(float *)(ray + 0x20);
                        fVar114 = *(float *)(ray + 0x24);
                        fVar117 = *(float *)(ray + 0x28);
                        fVar129 = *(float *)(ray + 0x2c);
                        fVar151 = (fVar168 * fVar80 + fVar135 * fVar142) - fVar176;
                        fVar162 = (fVar168 * fVar169 + fVar135 * fVar122) - fVar181;
                        fVar165 = (fVar168 * fVar177 + fVar135 * fVar133) - fVar148;
                        fVar167 = (fVar168 * fVar182 + fVar135 * fVar136) - fVar149;
                        fVar235 = (fVar179 * fVar80 + fVar78 * fVar142) - fVar96;
                        fVar236 = (fVar179 * fVar169 + fVar78 * fVar122) - fVar104;
                        fVar237 = (fVar179 * fVar177 + fVar78 * fVar133) - fVar106;
                        fVar238 = (fVar179 * fVar182 + fVar78 * fVar136) - fVar53;
                        fVar239 = (fVar147 * fVar80 + fVar77 * fVar142) - fVar79;
                        fVar240 = (fVar147 * fVar169 + fVar77 * fVar122) - fVar114;
                        fVar241 = (fVar147 * fVar177 + fVar77 * fVar133) - fVar117;
                        fVar242 = (fVar147 * fVar182 + fVar77 * fVar136) - fVar129;
                        fVar123 = local_1ac8 - fVar176;
                        fVar130 = fStack_1ac4 - fVar181;
                        fVar132 = fStack_1ac0 - fVar148;
                        fVar134 = fStack_1abc - fVar149;
                        fVar205 = fVar150 - fVar96;
                        fVar212 = fVar161 - fVar104;
                        fVar105 = fVar164 - fVar106;
                        fVar107 = fVar166 - fVar53;
                        fVar244 = fVar243 - fVar79;
                        fVar247 = fVar246 - fVar114;
                        fVar250 = fVar249 - fVar117;
                        fVar253 = fVar252 - fVar129;
                        fVar176 = fVar186 - fVar176;
                        fVar181 = fVar190 - fVar181;
                        fVar148 = fVar194 - fVar148;
                        fVar149 = fVar197 - fVar149;
                        fVar96 = fVar198 - fVar96;
                        fVar104 = fVar206 - fVar104;
                        fVar106 = fVar209 - fVar106;
                        fVar53 = fVar213 - fVar53;
                        fVar79 = fVar223 - fVar79;
                        fVar114 = fVar226 - fVar114;
                        fVar117 = fVar229 - fVar117;
                        fVar129 = fVar232 - fVar129;
                        fVar108 = fVar176 - fVar151;
                        fVar115 = fVar181 - fVar162;
                        fVar118 = fVar148 - fVar165;
                        fVar120 = fVar149 - fVar167;
                        fVar224 = fVar96 - fVar235;
                        fVar227 = fVar104 - fVar236;
                        fVar230 = fVar106 - fVar237;
                        fVar233 = fVar53 - fVar238;
                        fVar199 = fVar79 - fVar239;
                        fVar207 = fVar114 - fVar240;
                        fVar210 = fVar117 - fVar241;
                        fVar214 = fVar129 - fVar242;
                        fVar168 = *(float *)(ray + 0x60);
                        fVar179 = *(float *)(ray + 100);
                        fVar147 = *(float *)(ray + 0x68);
                        fVar135 = *(float *)(ray + 0x6c);
                        auVar20 = *(undefined1 (*) [12])(ray + 0x50);
                        fVar78 = *(float *)(ray + 0x5c);
                        fVar77 = *(float *)(ray + 0x40);
                        fVar131 = *(float *)(ray + 0x44);
                        fVar140 = *(float *)(ray + 0x48);
                        fVar141 = *(float *)(ray + 0x4c);
                        fVar152 = (fVar224 * (fVar79 + fVar239) - (fVar96 + fVar235) * fVar199) *
                                  fVar77 + ((fVar176 + fVar151) * fVar199 -
                                           (fVar79 + fVar239) * fVar108) * *(float *)(ray + 0x50) +
                                           (fVar108 * (fVar96 + fVar235) -
                                           (fVar176 + fVar151) * fVar224) * fVar168;
                        fVar163 = (fVar227 * (fVar114 + fVar240) - (fVar104 + fVar236) * fVar207) *
                                  fVar131 + ((fVar181 + fVar162) * fVar207 -
                                            (fVar114 + fVar240) * fVar115) * *(float *)(ray + 0x54)
                                            + (fVar115 * (fVar104 + fVar236) -
                                              (fVar181 + fVar162) * fVar227) * fVar179;
                        auVar155._0_8_ = CONCAT44(fVar163,fVar152);
                        auVar155._8_4_ =
                             (fVar230 * (fVar117 + fVar241) - (fVar106 + fVar237) * fVar210) *
                             fVar140 + ((fVar148 + fVar165) * fVar210 -
                                       (fVar117 + fVar241) * fVar118) * *(float *)(ray + 0x58) +
                                       (fVar118 * (fVar106 + fVar237) -
                                       (fVar148 + fVar165) * fVar230) * fVar147;
                        auVar155._12_4_ =
                             (fVar233 * (fVar129 + fVar242) - (fVar53 + fVar238) * fVar214) *
                             fVar141 + ((fVar149 + fVar167) * fVar214 -
                                       (fVar129 + fVar242) * fVar120) * fVar78 +
                                       (fVar120 * (fVar53 + fVar238) - (fVar149 + fVar167) * fVar233
                                       ) * fVar135;
                        fVar109 = fVar151 - fVar123;
                        fVar116 = fVar162 - fVar130;
                        fVar119 = fVar165 - fVar132;
                        fVar121 = fVar167 - fVar134;
                        fVar216 = fVar235 - fVar205;
                        fVar220 = fVar236 - fVar212;
                        fVar221 = fVar237 - fVar105;
                        fVar222 = fVar238 - fVar107;
                        local_1ad8._0_4_ = fVar239 - fVar244;
                        local_1ad8._4_4_ = fVar240 - fVar247;
                        fStack_1ad0 = fVar241 - fVar250;
                        fStack_1acc = fVar242 - fVar253;
                        local_1c28 = auVar20._0_4_;
                        fStack_1c24 = auVar20._4_4_;
                        fStack_1c20 = auVar20._8_4_;
                        fVar187 = (fVar216 * (fVar239 + fVar244) -
                                  (fVar235 + fVar205) * (float)local_1ad8._0_4_) * fVar77 +
                                  ((fVar151 + fVar123) * (float)local_1ad8._0_4_ -
                                  (fVar239 + fVar244) * fVar109) * local_1c28 +
                                  (fVar109 * (fVar235 + fVar205) - (fVar151 + fVar123) * fVar216) *
                                  fVar168;
                        fVar191 = (fVar220 * (fVar240 + fVar247) -
                                  (fVar236 + fVar212) * (float)local_1ad8._4_4_) * fVar131 +
                                  ((fVar162 + fVar130) * (float)local_1ad8._4_4_ -
                                  (fVar240 + fVar247) * fVar116) * fStack_1c24 +
                                  (fVar116 * (fVar236 + fVar212) - (fVar162 + fVar130) * fVar220) *
                                  fVar179;
                        uStack_1bf0._0_4_ =
                             (fVar221 * (fVar241 + fVar250) - (fVar237 + fVar105) * fStack_1ad0) *
                             fVar140 + ((fVar165 + fVar132) * fStack_1ad0 -
                                       (fVar241 + fVar250) * fVar119) * fStack_1c20 +
                                       (fVar119 * (fVar237 + fVar105) -
                                       (fVar165 + fVar132) * fVar221) * fVar147;
                        uStack_1bf0._4_4_ =
                             (fVar222 * (fVar242 + fVar253) - (fVar238 + fVar107) * fStack_1acc) *
                             fVar141 + ((fVar167 + fVar134) * fStack_1acc -
                                       (fVar242 + fVar253) * fVar121) * fVar78 +
                                       (fVar121 * (fVar238 + fVar107) -
                                       (fVar167 + fVar134) * fVar222) * fVar135;
                        fVar200 = fVar123 - fVar176;
                        fVar208 = fVar130 - fVar181;
                        fVar211 = fVar132 - fVar148;
                        fVar215 = fVar134 - fVar149;
                        fVar225 = fVar205 - fVar96;
                        fVar228 = fVar212 - fVar104;
                        fVar231 = fVar105 - fVar106;
                        fVar234 = fVar107 - fVar53;
                        fVar245 = fVar244 - fVar79;
                        fVar248 = fVar247 - fVar114;
                        fVar251 = fVar250 - fVar117;
                        fVar254 = fVar253 - fVar129;
                        fVar176 = (fVar225 * (fVar79 + fVar244) - (fVar96 + fVar205) * fVar245) *
                                  fVar77 + ((fVar176 + fVar123) * fVar245 -
                                           (fVar79 + fVar244) * fVar200) * local_1c28 +
                                           (fVar200 * (fVar96 + fVar205) -
                                           (fVar176 + fVar123) * fVar225) * fVar168;
                        fVar181 = (fVar228 * (fVar114 + fVar247) - (fVar104 + fVar212) * fVar248) *
                                  fVar131 + ((fVar181 + fVar130) * fVar248 -
                                            (fVar114 + fVar247) * fVar208) * fStack_1c24 +
                                            (fVar208 * (fVar104 + fVar212) -
                                            (fVar181 + fVar130) * fVar228) * fVar179;
                        fVar148 = (fVar231 * (fVar117 + fVar250) - (fVar106 + fVar105) * fVar251) *
                                  fVar140 + ((fVar148 + fVar132) * fVar251 -
                                            (fVar117 + fVar250) * fVar211) * fStack_1c20 +
                                            (fVar211 * (fVar106 + fVar105) -
                                            (fVar148 + fVar132) * fVar231) * fVar147;
                        fVar149 = (fVar234 * (fVar129 + fVar253) - (fVar53 + fVar107) * fVar254) *
                                  fVar141 + ((fVar149 + fVar134) * fVar254 -
                                            (fVar129 + fVar253) * fVar215) * fVar78 +
                                            (fVar215 * (fVar53 + fVar107) -
                                            (fVar149 + fVar134) * fVar234) * fVar135;
                        fVar96 = fVar152 + fVar187 + fVar176;
                        fVar104 = fVar163 + fVar191 + fVar181;
                        fVar106 = auVar155._8_4_ + (float)uStack_1bf0 + fVar148;
                        fVar53 = auVar155._12_4_ + uStack_1bf0._4_4_ + fVar149;
                        auVar64._8_4_ = auVar155._8_4_;
                        auVar64._0_8_ = auVar155._0_8_;
                        auVar64._12_4_ = auVar155._12_4_;
                        auVar11._4_4_ = fVar191;
                        auVar11._0_4_ = fVar187;
                        auVar11._8_4_ = (float)uStack_1bf0;
                        auVar11._12_4_ = uStack_1bf0._4_4_;
                        auVar55 = minps(auVar64,auVar11);
                        auVar16._4_4_ = fVar181;
                        auVar16._0_4_ = fVar176;
                        auVar16._8_4_ = fVar148;
                        auVar16._12_4_ = fVar149;
                        auVar55 = minps(auVar55,auVar16);
                        local_1bf8 = CONCAT44(fVar191,fVar187);
                        auVar12._4_4_ = fVar191;
                        auVar12._0_4_ = fVar187;
                        auVar12._8_4_ = (float)uStack_1bf0;
                        auVar12._12_4_ = uStack_1bf0._4_4_;
                        auVar156 = maxps(auVar155,auVar12);
                        auVar17._4_4_ = fVar181;
                        auVar17._0_4_ = fVar176;
                        auVar17._8_4_ = fVar148;
                        auVar17._12_4_ = fVar149;
                        auVar156 = maxps(auVar156,auVar17);
                        fVar176 = ABS(fVar96) * 1.1920929e-07;
                        fVar181 = ABS(fVar104) * 1.1920929e-07;
                        fVar148 = ABS(fVar106) * 1.1920929e-07;
                        fVar149 = ABS(fVar53) * 1.1920929e-07;
                        auVar157._0_8_ =
                             CONCAT44(-(uint)(auVar156._4_4_ <= fVar181 || -fVar181 <= auVar55._4_4_
                                             ) & local_1c38._4_4_,
                                      -(uint)(auVar156._0_4_ <= fVar176 || -fVar176 <= auVar55._0_4_
                                             ) & local_1c38._0_4_);
                        auVar157._8_4_ =
                             -(uint)(auVar156._8_4_ <= fVar148 || -fVar148 <= auVar55._8_4_) &
                             (uint)fStack_1c30;
                        auVar157._12_4_ =
                             -(uint)(auVar156._12_4_ <= fVar149 || -fVar149 <= auVar55._12_4_) &
                             (uint)fStack_1c2c;
                        iVar28 = movmskps((int)local_1ae0,auVar157);
                        uStack_1c70 = auVar155._8_8_;
                        if (iVar28 == 0) {
                          auVar145._8_4_ = auVar157._8_4_;
                          auVar145._0_8_ = auVar157._0_8_;
                          auVar145._12_4_ = auVar157._12_4_;
                        }
                        else {
                          auVar138._0_4_ = fVar224 * (float)local_1ad8._0_4_ - fVar216 * fVar199;
                          auVar138._4_4_ = fVar227 * (float)local_1ad8._4_4_ - fVar220 * fVar207;
                          auVar138._8_4_ = fVar230 * fStack_1ad0 - fVar221 * fVar210;
                          auVar138._12_4_ = fVar233 * fStack_1acc - fVar222 * fVar214;
                          auVar217._0_4_ = fVar216 * fVar245 - fVar225 * (float)local_1ad8._0_4_;
                          auVar217._4_4_ = fVar220 * fVar248 - fVar228 * (float)local_1ad8._4_4_;
                          auVar217._8_4_ = fVar221 * fVar251 - fVar231 * fStack_1ad0;
                          auVar217._12_4_ = fVar222 * fVar254 - fVar234 * fStack_1acc;
                          auVar65._4_4_ =
                               -(uint)(ABS(fVar220 * fVar207) <
                                      ABS(fVar228 * (float)local_1ad8._4_4_));
                          auVar65._0_4_ =
                               -(uint)(ABS(fVar216 * fVar199) <
                                      ABS(fVar225 * (float)local_1ad8._0_4_));
                          auVar65._8_4_ =
                               -(uint)(ABS(fVar221 * fVar210) < ABS(fVar231 * fStack_1ad0));
                          auVar65._12_4_ =
                               -(uint)(ABS(fVar222 * fVar214) < ABS(fVar234 * fStack_1acc));
                          auVar218 = blendvps(auVar217,auVar138,auVar65);
                          auVar201._0_4_ = fVar200 * (float)local_1ad8._0_4_ - fVar109 * fVar245;
                          auVar201._4_4_ = fVar208 * (float)local_1ad8._4_4_ - fVar116 * fVar248;
                          auVar201._8_4_ = fVar211 * fStack_1ad0 - fVar119 * fVar251;
                          auVar201._12_4_ = fVar215 * fStack_1acc - fVar121 * fVar254;
                          auVar66._4_4_ =
                               -(uint)(ABS(fVar115 * (float)local_1ad8._4_4_) <
                                      ABS(fVar116 * fVar248));
                          auVar66._0_4_ =
                               -(uint)(ABS(fVar108 * (float)local_1ad8._0_4_) <
                                      ABS(fVar109 * fVar245));
                          auVar66._8_4_ =
                               -(uint)(ABS(fVar118 * fStack_1ad0) < ABS(fVar119 * fVar251));
                          auVar66._12_4_ =
                               -(uint)(ABS(fVar120 * fStack_1acc) < ABS(fVar121 * fVar254));
                          auVar14._4_4_ = fVar207 * fVar116 - fVar115 * (float)local_1ad8._4_4_;
                          auVar14._0_4_ = fVar199 * fVar109 - fVar108 * (float)local_1ad8._0_4_;
                          auVar14._8_4_ = fVar210 * fVar119 - fVar118 * fStack_1ad0;
                          auVar14._12_4_ = fVar214 * fVar121 - fVar120 * fStack_1acc;
                          aVar82 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                   blendvps(auVar201,auVar14,auVar66);
                          auVar172._0_4_ = fVar108 * fVar216 - fVar109 * fVar224;
                          auVar172._4_4_ = fVar115 * fVar220 - fVar116 * fVar227;
                          auVar172._8_4_ = fVar118 * fVar221 - fVar119 * fVar230;
                          auVar172._12_4_ = fVar120 * fVar222 - fVar121 * fVar233;
                          auVar112._0_4_ = fVar109 * fVar225 - fVar200 * fVar216;
                          auVar112._4_4_ = fVar116 * fVar228 - fVar208 * fVar220;
                          auVar112._8_4_ = fVar119 * fVar231 - fVar211 * fVar221;
                          auVar112._12_4_ = fVar121 * fVar234 - fVar215 * fVar222;
                          auVar67._4_4_ = -(uint)(ABS(fVar116 * fVar227) < ABS(fVar208 * fVar220));
                          auVar67._0_4_ = -(uint)(ABS(fVar109 * fVar224) < ABS(fVar200 * fVar216));
                          auVar67._8_4_ = -(uint)(ABS(fVar119 * fVar230) < ABS(fVar211 * fVar221));
                          auVar67._12_4_ = -(uint)(ABS(fVar121 * fVar233) < ABS(fVar215 * fVar222));
                          auVar156 = blendvps(auVar112,auVar172,auVar67);
                          fVar168 = fVar77 * auVar218._0_4_ +
                                    local_1c28 * aVar82.v[0] + fVar168 * auVar156._0_4_;
                          fVar176 = fVar131 * auVar218._4_4_ +
                                    fStack_1c24 * aVar82.v[1] + fVar179 * auVar156._4_4_;
                          fVar179 = fVar140 * auVar218._8_4_ +
                                    fStack_1c20 * aVar82.v[2] + fVar147 * auVar156._8_4_;
                          fVar181 = fVar141 * auVar218._12_4_ +
                                    fVar78 * aVar82.v[3] + fVar135 * auVar156._12_4_;
                          auVar143._0_4_ = fVar168 + fVar168;
                          auVar143._4_4_ = fVar176 + fVar176;
                          auVar143._8_4_ = fVar179 + fVar179;
                          auVar143._12_4_ = fVar181 + fVar181;
                          auVar84._0_4_ = fVar239 * auVar156._0_4_;
                          auVar84._4_4_ = fVar240 * auVar156._4_4_;
                          auVar84._8_4_ = fVar241 * auVar156._8_4_;
                          auVar84._12_4_ = fVar242 * auVar156._12_4_;
                          fVar147 = fVar151 * auVar218._0_4_ + fVar235 * aVar82.v[0] + auVar84._0_4_
                          ;
                          fVar148 = fVar162 * auVar218._4_4_ + fVar236 * aVar82.v[1] + auVar84._4_4_
                          ;
                          fVar149 = fVar165 * auVar218._8_4_ + fVar237 * aVar82.v[2] + auVar84._8_4_
                          ;
                          fVar135 = fVar167 * auVar218._12_4_ +
                                    fVar238 * aVar82.v[3] + auVar84._12_4_;
                          auVar55 = rcpps(auVar84,auVar143);
                          fVar168 = auVar55._0_4_;
                          fVar176 = auVar55._4_4_;
                          fVar179 = auVar55._8_4_;
                          fVar181 = auVar55._12_4_;
                          fVar168 = ((1.0 - auVar143._0_4_ * fVar168) * fVar168 + fVar168) *
                                    (fVar147 + fVar147);
                          fVar176 = ((1.0 - auVar143._4_4_ * fVar176) * fVar176 + fVar176) *
                                    (fVar148 + fVar148);
                          fVar179 = ((1.0 - auVar143._8_4_ * fVar179) * fVar179 + fVar179) *
                                    (fVar149 + fVar149);
                          fVar181 = ((1.0 - auVar143._12_4_ * fVar181) * fVar181 + fVar181) *
                                    (fVar135 + fVar135);
                          auVar144._0_4_ =
                               (int)((uint)((fVar168 <= *(float *)(ray + 0x80) &&
                                            *(float *)(ray + 0x30) <= fVar168) &&
                                           auVar143._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                          auVar144._4_4_ =
                               (int)((uint)((fVar176 <= *(float *)(ray + 0x84) &&
                                            *(float *)(ray + 0x34) <= fVar176) &&
                                           auVar143._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                          auVar144._8_4_ =
                               (int)((uint)((fVar179 <= *(float *)(ray + 0x88) &&
                                            *(float *)(ray + 0x38) <= fVar179) &&
                                           auVar143._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                          auVar144._12_4_ =
                               (int)((uint)((fVar181 <= *(float *)(ray + 0x8c) &&
                                            *(float *)(ray + 0x3c) <= fVar181) &&
                                           auVar143._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                          auVar145 = auVar144 & auVar157;
                          iVar28 = movmskps(iVar28,auVar145);
                          if (iVar28 != 0) {
                            uStack_1700 = uStack_1c70;
                            local_1718 = local_1bf8;
                            uStack_1710 = uStack_1bf0;
                            local_1728 = CONCAT44(fVar104,fVar96);
                            uStack_1720 = CONCAT44(fVar53,fVar106);
                            local_1768 = auVar156;
                            local_1758 = aVar82;
                            local_1748 = auVar218;
                            local_1738 = fVar168;
                            fStack_1734 = fVar176;
                            fStack_1730 = fVar179;
                            fStack_172c = fVar181;
                            local_1708 = auVar155._0_8_;
                          }
                        }
                        auVar160._4_4_ = fVar190;
                        auVar160._0_4_ = fVar186;
                        auVar160._8_4_ = fVar194;
                        auVar160._12_4_ = fVar197;
                        auVar139._4_4_ = fVar206;
                        auVar139._0_4_ = fVar198;
                        auVar139._8_4_ = fVar209;
                        auVar139._12_4_ = fVar213;
                        fVar168 = *(float *)(local_1af8 + lVar42);
                        fVar176 = *(float *)(local_1b08 + lVar42);
                        fVar179 = *(float *)(local_1b00 + lVar42);
                        fVar181 = *(float *)(local_1af0 + lVar42 + 0x30);
                        fVar147 = *(float *)(local_1ae8 + lVar42 + 0x30);
                        fVar148 = *(float *)(local_1ae0 + lVar42 + 0x30);
                        uVar26 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                        pRVar2 = (context->scene->geometries).items;
                        pGVar3 = pRVar2[uVar26].ptr;
                        uVar170 = pGVar3->mask;
                        auVar173._0_4_ = -(uint)((uVar170 & *(uint *)(ray + 0x90)) == 0);
                        auVar173._4_4_ = -(uint)((uVar170 & *(uint *)(ray + 0x94)) == 0);
                        auVar173._8_4_ = -(uint)((uVar170 & *(uint *)(ray + 0x98)) == 0);
                        auVar173._12_4_ = -(uint)((uVar170 & *(uint *)(ray + 0x9c)) == 0);
                        auVar174 = ~auVar173 & auVar145;
                        uVar178 = movmskps((int)pRVar2,auVar174);
                        pRVar37 = (RTCIntersectArguments *)(ulong)uVar178;
                        pRVar34 = (RTCIntersectArguments *)pre.super_Precalculations.grid;
                        if (uVar178 != 0) {
                          pRVar37 = (RTCIntersectArguments *)
                                    (ulong)*(uint *)(pre.super_Precalculations.grid + 0x1c);
                          pRVar34 = context->args;
                          if ((pRVar34->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar19._8_8_ = uStack_1720;
                            auVar19._0_8_ = local_1728;
                            fVar106 = (float)((ulong)local_1728 >> 0x20);
                            fVar78 = (float)((ulong)uStack_1720 >> 0x20);
                            auVar55 = rcpps(ZEXT416(uVar170),auVar19);
                            fVar149 = auVar55._0_4_;
                            fVar96 = auVar55._4_4_;
                            fVar104 = auVar55._8_4_;
                            fVar135 = auVar55._12_4_;
                            fVar149 = (float)(-(uint)(1e-18 <= ABS((float)local_1728)) &
                                             (uint)(((float)DAT_01f46a60 -
                                                    (float)local_1728 * fVar149) * fVar149 + fVar149
                                                   ));
                            fVar96 = (float)(-(uint)(1e-18 <= ABS(fVar106)) &
                                            (uint)((DAT_01f46a60._4_4_ - fVar106 * fVar96) * fVar96
                                                  + fVar96));
                            fVar104 = (float)(-(uint)(1e-18 <= ABS((float)uStack_1720)) &
                                             (uint)((DAT_01f46a60._8_4_ -
                                                    (float)uStack_1720 * fVar104) * fVar104 +
                                                   fVar104));
                            fVar135 = (float)(-(uint)(1e-18 <= ABS(fVar78)) &
                                             (uint)((DAT_01f46a60._12_4_ - fVar78 * fVar135) *
                                                    fVar135 + fVar135));
                            auVar72._0_4_ = (float)local_1708 * fVar149;
                            auVar72._4_4_ = local_1708._4_4_ * fVar96;
                            auVar72._8_4_ = (float)uStack_1700 * fVar104;
                            auVar72._12_4_ = uStack_1700._4_4_ * fVar135;
                            auVar55 = minps(auVar72,_DAT_01f46a60);
                            auVar87._0_4_ = fVar149 * (float)local_1718;
                            auVar87._4_4_ = fVar96 * local_1718._4_4_;
                            auVar87._8_4_ = fVar104 * (float)uStack_1710;
                            auVar87._12_4_ = fVar135 * uStack_1710._4_4_;
                            auVar156 = minps(auVar87,_DAT_01f46a60);
                            local_1ad8._0_4_ = *(uint *)(pre.super_Precalculations.grid + 0x1c);
                            uVar170 = *(uint *)(local_1b80 + lVar42 + -4);
                            auVar100._4_4_ = uVar170;
                            auVar100._0_4_ = uVar170;
                            auVar100._8_4_ = uVar170;
                            auVar100._12_4_ = uVar170;
                            auVar218 = pblendw(auVar100,(undefined1  [16])0x0,0xaa);
                            uVar178 = *(uint *)(local_1b18 + lVar42 + 0x2c);
                            auVar128._4_4_ = uVar178;
                            auVar128._0_4_ = uVar178;
                            auVar128._8_4_ = uVar178;
                            auVar128._12_4_ = uVar178;
                            fVar149 = auVar55._0_4_;
                            fVar96 = auVar55._4_4_;
                            fVar104 = auVar55._8_4_;
                            fVar135 = auVar55._12_4_;
                            fVar106 = auVar156._0_4_;
                            fVar79 = ((float)DAT_01f46a60 - fVar149) - fVar106;
                            fVar78 = auVar156._4_4_;
                            fVar114 = (DAT_01f46a60._4_4_ - fVar96) - fVar78;
                            fVar53 = auVar156._8_4_;
                            fVar117 = (DAT_01f46a60._8_4_ - fVar104) - fVar53;
                            fVar77 = auVar156._12_4_;
                            fVar129 = (DAT_01f46a60._12_4_ - fVar135) - fVar77;
                            auVar156 = pblendw(auVar128,(undefined1  [16])0x0,0xaa);
                            uVar180 = *(uint *)(local_1b80 + lVar42);
                            auVar88._4_4_ = uVar180;
                            auVar88._0_4_ = uVar180;
                            auVar88._8_4_ = uVar180;
                            auVar88._12_4_ = uVar180;
                            auVar55 = pblendw(auVar88,(undefined1  [16])0x0,0xaa);
                            local_19f8 = (float)auVar55._0_4_ * 0.00012207031 * fVar149 +
                                         (float)auVar156._0_4_ * 0.00012207031 * fVar106 +
                                         (float)auVar218._0_4_ * 0.00012207031 * fVar79;
                            fStack_19f4 = (float)auVar55._4_4_ * 0.00012207031 * fVar96 +
                                          (float)auVar156._4_4_ * 0.00012207031 * fVar78 +
                                          (float)auVar218._4_4_ * 0.00012207031 * fVar114;
                            fStack_19f0 = (float)auVar55._8_4_ * 0.00012207031 * fVar104 +
                                          (float)auVar156._8_4_ * 0.00012207031 * fVar53 +
                                          (float)auVar218._8_4_ * 0.00012207031 * fVar117;
                            fStack_19ec = (float)auVar55._12_4_ * 0.00012207031 * fVar135 +
                                          (float)auVar156._12_4_ * 0.00012207031 * fVar77 +
                                          (float)auVar218._12_4_ * 0.00012207031 * fVar129;
                            local_1a48._0_8_ = local_1748._0_8_;
                            local_1a48._8_8_ = local_1748._8_8_;
                            local_1a48.field_0.y.field_0 =
                                 (vfloat_impl<4>)(vfloat_impl<4>)local_1758;
                            local_1a48._32_8_ = local_1768._0_8_;
                            local_1a48._40_8_ = local_1768._8_8_;
                            local_1a18 = CONCAT44(fStack_1734,local_1738);
                            uStack_1a10 = CONCAT44(fStack_172c,fStack_1730);
                            local_1a08 = CONCAT44((float)(uVar180 >> 0x10) * 0.00012207031 * fVar96
                                                  + (float)(uVar178 >> 0x10) * 0.00012207031 *
                                                    fVar78 + fVar114 * (float)(uVar170 >> 0x10) *
                                                                       0.00012207031,
                                                  (float)(uVar180 >> 0x10) * 0.00012207031 * fVar149
                                                  + (float)(uVar178 >> 0x10) * 0.00012207031 *
                                                    fVar106 + fVar79 * (float)(uVar170 >> 0x10) *
                                                                       0.00012207031);
                            uStack_1a00 = CONCAT44((float)(uVar180 >> 0x10) * 0.00012207031 *
                                                   fVar135 + (float)(uVar178 >> 0x10) *
                                                             0.00012207031 * fVar77 +
                                                             fVar129 * (float)(uVar170 >> 0x10) *
                                                                       0.00012207031,
                                                   (float)(uVar180 >> 0x10) * 0.00012207031 *
                                                   fVar104 + (float)(uVar178 >> 0x10) *
                                                             0.00012207031 * fVar53 +
                                                             fVar117 * (float)(uVar170 >> 0x10) *
                                                                       0.00012207031);
                            args.valid = (int *)&Ng;
                            args.geometryUserPtr = &t;
                            args.context = (RTCRayQueryContext *)&v;
                            args.ray = (RTCRayN *)&u;
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                            ::
                            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                 *)&local_1a48.field_0);
                            local_1a48._0_8_ = Ng.field_0._0_8_;
                            local_1a48._8_8_ = Ng.field_0._8_8_;
                            local_1a48._32_8_ = Ng.field_0._32_8_;
                            local_1a48._40_8_ = Ng.field_0._40_8_;
                            local_1a18 = u.field_0._0_8_;
                            uStack_1a10 = u.field_0._8_8_;
                            local_1a08 = v.field_0._0_8_;
                            uStack_1a00 = v.field_0._8_8_;
                            local_19f8 = (float)local_1ad8._0_4_;
                            fStack_19f4 = (float)local_1ad8._0_4_;
                            fStack_19f0 = (float)local_1ad8._0_4_;
                            fStack_19ec = (float)local_1ad8._0_4_;
                            local_19e8._4_4_ = uVar26;
                            local_19e8._0_4_ = uVar26;
                            local_19e8._8_4_ = uVar26;
                            local_19e8._12_4_ = uVar26;
                            pRVar37 = &local_19d8;
                            local_19d8.flags = context->user->instID[0];
                            local_19d8.filter._0_4_ = context->user->instPrimID[0];
                            _local_1ad8 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar55 = blendvps(_local_1ad8,(undefined1  [16])t.field_0,auVar174);
                            *(undefined1 (*) [16])(ray + 0x80) = auVar55;
                            args.valid = (int *)local_1b38;
                            args.geometryUserPtr = pGVar3->userPtr;
                            args.context = context->user;
                            args.hit = (RTCHitN *)&local_1a48;
                            args.N = 4;
                            pRVar34 = (RTCIntersectArguments *)pGVar3->occlusionFilterN;
                            args.ray = (RTCRayN *)ray;
                            local_1b38 = auVar174;
                            local_19d8.feature_mask = local_19d8.flags;
                            local_19d8.context._0_4_ = local_19d8.flags;
                            local_19d8.context._4_4_ = local_19d8.flags;
                            local_19d8.filter._4_4_ = (uint)local_19d8.filter;
                            local_19d8.intersect._0_4_ = (uint)local_19d8.filter;
                            local_19d8.intersect._4_4_ = (uint)local_19d8.filter;
                            if (pRVar34 != (RTCIntersectArguments *)0x0) {
                              pRVar34 = (RTCIntersectArguments *)(*(code *)pRVar34)(&args);
                            }
                            if (local_1b38 == (undefined1  [16])0x0) {
                              auVar91._8_4_ = 0xffffffff;
                              auVar91._0_8_ = 0xffffffffffffffff;
                              auVar91._12_4_ = 0xffffffff;
                              auVar91 = auVar91 ^ _DAT_01f46b70;
                            }
                            else {
                              pRVar37 = context->args;
                              if (pRVar37->filter == (RTCFilterFunctionN)0x0) {
                              }
                              else if (((pRVar37->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                        != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                      (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                                (*pRVar37->filter)(&args);
                              }
                              auVar74._0_4_ = -(uint)(local_1b38._0_4_ == 0);
                              auVar74._4_4_ = -(uint)(local_1b38._4_4_ == 0);
                              auVar74._8_4_ = -(uint)(local_1b38._8_4_ == 0);
                              auVar74._12_4_ = -(uint)(local_1b38._12_4_ == 0);
                              auVar91 = auVar74 ^ _DAT_01f46b70;
                              auVar55 = blendvps(_DAT_01f45a40,
                                                 *(undefined1 (*) [16])(args.ray + 0x80),auVar74);
                              *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
                              pRVar34 = (RTCIntersectArguments *)args.ray;
                            }
                            auVar92._0_4_ = auVar91._0_4_ << 0x1f;
                            auVar92._4_4_ = auVar91._4_4_ << 0x1f;
                            auVar92._8_4_ = auVar91._8_4_ << 0x1f;
                            auVar92._12_4_ = auVar91._12_4_ << 0x1f;
                            auVar174._0_4_ = auVar92._0_4_ >> 0x1f;
                            auVar174._4_4_ = auVar92._4_4_ >> 0x1f;
                            auVar174._8_4_ = auVar92._8_4_ >> 0x1f;
                            auVar174._12_4_ = auVar92._12_4_ >> 0x1f;
                            auVar55 = blendvps(_local_1ad8,*(undefined1 (*) [16])(ray + 0x80),
                                               auVar92);
                            *(undefined1 (*) [16])(ray + 0x80) = auVar55;
                          }
                          _local_1c38 = ~auVar174 & _local_1c38;
                        }
                        iVar28 = movmskps((int)pRVar34,_local_1c38);
                        if (iVar28 == 0) {
                          fVar168 = INFINITY;
                          fVar176 = INFINITY;
                          fVar179 = INFINITY;
                          fVar181 = INFINITY;
                          break;
                        }
                        fVar149 = *(float *)ray;
                        fVar96 = *(float *)(ray + 4);
                        fVar104 = *(float *)(ray + 8);
                        fVar135 = *(float *)(ray + 0xc);
                        fVar106 = *(float *)(ray + 0x10);
                        fVar78 = *(float *)(ray + 0x14);
                        fVar53 = *(float *)(ray + 0x18);
                        fVar77 = *(float *)(ray + 0x1c);
                        fVar79 = *(float *)(ray + 0x20);
                        fVar114 = *(float *)(ray + 0x24);
                        fVar117 = *(float *)(ray + 0x28);
                        fVar129 = *(float *)(ray + 0x2c);
                        fVar131 = *(float *)(ray + 0x40);
                        fVar140 = *(float *)(ray + 0x44);
                        fVar141 = *(float *)(ray + 0x48);
                        fVar205 = *(float *)(ray + 0x4c);
                        fVar167 = auVar160._0_4_ - fVar149;
                        fVar187 = auVar160._4_4_ - fVar96;
                        fVar191 = auVar160._8_4_ - fVar104;
                        fVar197 = auVar160._12_4_ - fVar135;
                        fVar212 = auVar139._0_4_ - fVar106;
                        fVar108 = auVar139._4_4_ - fVar78;
                        fVar116 = auVar139._8_4_ - fVar53;
                        fVar120 = auVar139._12_4_ - fVar77;
                        fVar223 = fVar223 - fVar79;
                        fVar226 = fVar226 - fVar114;
                        fVar229 = fVar229 - fVar117;
                        fVar232 = fVar232 - fVar129;
                        fVar220 = local_1ac8 - fVar149;
                        fVar222 = fStack_1ac4 - fVar96;
                        fVar225 = fStack_1ac0 - fVar104;
                        fVar228 = fStack_1abc - fVar135;
                        fVar150 = fVar150 - fVar106;
                        fVar161 = fVar161 - fVar78;
                        fVar164 = fVar164 - fVar53;
                        fVar166 = fVar166 - fVar77;
                        fVar243 = fVar243 - fVar79;
                        fVar246 = fVar246 - fVar114;
                        fVar249 = fVar249 - fVar117;
                        fVar252 = fVar252 - fVar129;
                        fVar149 = (fVar168 * fVar80 + fVar181 * fVar142) - fVar149;
                        fVar96 = (fVar168 * fVar169 + fVar181 * fVar122) - fVar96;
                        fVar104 = (fVar168 * fVar177 + fVar181 * fVar133) - fVar104;
                        fVar135 = (fVar168 * fVar182 + fVar181 * fVar136) - fVar135;
                        fVar106 = (fVar176 * fVar80 + fVar147 * fVar142) - fVar106;
                        fVar78 = (fVar176 * fVar169 + fVar147 * fVar122) - fVar78;
                        fVar53 = (fVar176 * fVar177 + fVar147 * fVar133) - fVar53;
                        fVar77 = (fVar176 * fVar182 + fVar147 * fVar136) - fVar77;
                        fVar79 = (fVar179 * fVar80 + fVar148 * fVar142) - fVar79;
                        fVar114 = (fVar179 * fVar169 + fVar148 * fVar122) - fVar114;
                        fVar117 = (fVar179 * fVar177 + fVar148 * fVar133) - fVar117;
                        fVar129 = (fVar179 * fVar182 + fVar148 * fVar136) - fVar129;
                        fVar130 = fVar149 - fVar167;
                        fVar134 = fVar96 - fVar187;
                        fVar152 = fVar104 - fVar191;
                        fVar163 = fVar135 - fVar197;
                        fVar105 = fVar106 - fVar212;
                        fVar109 = fVar78 - fVar108;
                        fVar118 = fVar53 - fVar116;
                        fVar121 = fVar77 - fVar120;
                        fVar186 = fVar79 - fVar223;
                        fVar190 = fVar114 - fVar226;
                        fVar194 = fVar117 - fVar229;
                        fVar198 = fVar129 - fVar232;
                        local_1ac8 = *(float *)(ray + 0x60);
                        fStack_1ac4 = *(float *)(ray + 100);
                        uVar21 = *(undefined8 *)(ray + 0x60);
                        fStack_1ac0 = *(float *)(ray + 0x68);
                        fStack_1abc = *(float *)(ray + 0x6c);
                        fVar107 = fVar167 - fVar220;
                        fVar115 = fVar187 - fVar222;
                        fVar119 = fVar191 - fVar225;
                        fVar123 = fVar197 - fVar228;
                        local_1c88 = (float)*(undefined8 *)(ray + 0x50);
                        fStack_1c84 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                        fStack_1c80 = (float)*(undefined8 *)(ray + 0x58);
                        fStack_1c7c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                        fVar132 = fVar212 - fVar150;
                        fVar151 = fVar108 - fVar161;
                        fVar162 = fVar116 - fVar164;
                        fVar165 = fVar120 - fVar166;
                        fVar231 = (fVar105 * (fVar79 + fVar223) - (fVar106 + fVar212) * fVar186) *
                                  fVar131 + ((fVar149 + fVar167) * fVar186 -
                                            (fVar79 + fVar223) * fVar130) * local_1c88 +
                                            (fVar130 * (fVar106 + fVar212) -
                                            (fVar149 + fVar167) * fVar105) * local_1ac8;
                        fVar233 = (fVar109 * (fVar114 + fVar226) - (fVar78 + fVar108) * fVar190) *
                                  fVar140 + ((fVar96 + fVar187) * fVar190 -
                                            (fVar114 + fVar226) * fVar134) * fStack_1c84 +
                                            (fVar134 * (fVar78 + fVar108) -
                                            (fVar96 + fVar187) * fVar109) * fStack_1ac4;
                        uStack_1c10._0_4_ =
                             (fVar118 * (fVar117 + fVar229) - (fVar53 + fVar116) * fVar194) *
                             fVar141 + ((fVar104 + fVar191) * fVar194 -
                                       (fVar117 + fVar229) * fVar152) * fStack_1c80 +
                                       (fVar152 * (fVar53 + fVar116) - (fVar104 + fVar191) * fVar118
                                       ) * fStack_1ac0;
                        uStack_1c10._4_4_ =
                             (fVar121 * (fVar129 + fVar232) - (fVar77 + fVar120) * fVar198) *
                             fVar205 + ((fVar135 + fVar197) * fVar198 -
                                       (fVar129 + fVar232) * fVar163) * fStack_1c7c +
                                       (fVar163 * (fVar77 + fVar120) - (fVar135 + fVar197) * fVar121
                                       ) * fStack_1abc;
                        fVar208 = fVar223 - fVar243;
                        fVar209 = fVar226 - fVar246;
                        fVar210 = fVar229 - fVar249;
                        fVar211 = fVar232 - fVar252;
                        fVar168 = (float)uVar21;
                        fVar176 = (float)((ulong)uVar21 >> 0x20);
                        fVar179 = (fVar132 * (fVar223 + fVar243) - (fVar212 + fVar150) * fVar208) *
                                  fVar131 + ((fVar167 + fVar220) * fVar208 -
                                            (fVar223 + fVar243) * fVar107) * local_1c88 +
                                            (fVar107 * (fVar212 + fVar150) -
                                            (fVar167 + fVar220) * fVar132) * fVar168;
                        fVar181 = (fVar151 * (fVar226 + fVar246) - (fVar108 + fVar161) * fVar209) *
                                  fVar140 + ((fVar187 + fVar222) * fVar209 -
                                            (fVar226 + fVar246) * fVar115) * fStack_1c84 +
                                            (fVar115 * (fVar108 + fVar161) -
                                            (fVar187 + fVar222) * fVar151) * fVar176;
                        auVar158._0_8_ = CONCAT44(fVar181,fVar179);
                        auVar158._8_4_ =
                             (fVar162 * (fVar229 + fVar249) - (fVar116 + fVar164) * fVar210) *
                             fVar141 + ((fVar191 + fVar225) * fVar210 -
                                       (fVar229 + fVar249) * fVar119) * fStack_1c80 +
                                       (fVar119 * (fVar116 + fVar164) -
                                       (fVar191 + fVar225) * fVar162) * fStack_1ac0;
                        auVar158._12_4_ =
                             (fVar165 * (fVar232 + fVar252) - (fVar120 + fVar166) * fVar211) *
                             fVar205 + ((fVar197 + fVar228) * fVar211 -
                                       (fVar232 + fVar252) * fVar123) * fStack_1c7c +
                                       (fVar123 * (fVar120 + fVar166) -
                                       (fVar197 + fVar228) * fVar165) * fStack_1abc;
                        fVar199 = fVar220 - fVar149;
                        fVar200 = fVar222 - fVar96;
                        fVar206 = fVar225 - fVar104;
                        fVar207 = fVar228 - fVar135;
                        fVar213 = fVar150 - fVar106;
                        fVar214 = fVar161 - fVar78;
                        fVar215 = fVar164 - fVar53;
                        fVar216 = fVar166 - fVar77;
                        fVar221 = fVar243 - fVar79;
                        fVar224 = fVar246 - fVar114;
                        fVar227 = fVar249 - fVar117;
                        fVar230 = fVar252 - fVar129;
                        auVar68._0_4_ =
                             (fVar213 * (fVar79 + fVar243) - (fVar106 + fVar150) * fVar221) *
                             fVar131 + ((fVar149 + fVar220) * fVar221 - (fVar79 + fVar243) * fVar199
                                       ) * local_1c88 +
                                       (fVar199 * (fVar106 + fVar150) -
                                       (fVar149 + fVar220) * fVar213) * fVar168;
                        auVar68._4_4_ =
                             (fVar214 * (fVar114 + fVar246) - (fVar78 + fVar161) * fVar224) *
                             fVar140 + ((fVar96 + fVar222) * fVar224 - (fVar114 + fVar246) * fVar200
                                       ) * fStack_1c84 +
                                       (fVar200 * (fVar78 + fVar161) - (fVar96 + fVar222) * fVar214)
                                       * fVar176;
                        auVar68._8_4_ =
                             (fVar215 * (fVar117 + fVar249) - (fVar53 + fVar164) * fVar227) *
                             fVar141 + ((fVar104 + fVar225) * fVar227 -
                                       (fVar117 + fVar249) * fVar206) * fStack_1c80 +
                                       (fVar206 * (fVar53 + fVar164) - (fVar104 + fVar225) * fVar215
                                       ) * fStack_1ac0;
                        auVar68._12_4_ =
                             (fVar216 * (fVar129 + fVar252) - (fVar77 + fVar166) * fVar230) *
                             fVar205 + ((fVar135 + fVar228) * fVar230 -
                                       (fVar129 + fVar252) * fVar207) * fStack_1c7c +
                                       (fVar207 * (fVar77 + fVar166) - (fVar135 + fVar228) * fVar216
                                       ) * fStack_1abc;
                        fVar147 = fVar231 + fVar179 + auVar68._0_4_;
                        fVar148 = fVar233 + fVar181 + auVar68._4_4_;
                        uStack_1b60._0_4_ = (float)uStack_1c10 + auVar158._8_4_ + auVar68._8_4_;
                        uStack_1b60._4_4_ = uStack_1c10._4_4_ + auVar158._12_4_ + auVar68._12_4_;
                        auVar85._4_4_ = fVar233;
                        auVar85._0_4_ = fVar231;
                        auVar85._8_4_ = (float)uStack_1c10;
                        auVar85._12_4_ = uStack_1c10._4_4_;
                        auVar55 = minps(auVar85,auVar158);
                        auVar55 = minps(auVar55,auVar68);
                        local_1c18 = CONCAT44(fVar233,fVar231);
                        auVar124._4_4_ = fVar233;
                        auVar124._0_4_ = fVar231;
                        auVar124._8_4_ = (float)uStack_1c10;
                        auVar124._12_4_ = uStack_1c10._4_4_;
                        auVar156 = maxps(auVar124,auVar158);
                        auVar156 = maxps(auVar156,auVar68);
                        fVar168 = ABS(fVar147) * 1.1920929e-07;
                        fVar176 = ABS(fVar148) * 1.1920929e-07;
                        fVar179 = ABS((float)uStack_1b60) * 1.1920929e-07;
                        fVar181 = ABS(uStack_1b60._4_4_) * 1.1920929e-07;
                        auVar125._0_8_ =
                             CONCAT44(-(uint)(auVar156._4_4_ <= fVar176 || -fVar176 <= auVar55._4_4_
                                             ) & local_1c38._4_4_,
                                      -(uint)(auVar156._0_4_ <= fVar168 || -fVar168 <= auVar55._0_4_
                                             ) & local_1c38._0_4_);
                        auVar125._8_4_ =
                             -(uint)(auVar156._8_4_ <= fVar179 || -fVar179 <= auVar55._8_4_) &
                             local_1c38._8_4_;
                        auVar125._12_4_ =
                             -(uint)(auVar156._12_4_ <= fVar181 || -fVar181 <= auVar55._12_4_) &
                             local_1c38._12_4_;
                        iVar28 = movmskps(iVar28,auVar125);
                        if (iVar28 == 0) {
                          auVar204._8_4_ = auVar125._8_4_;
                          auVar204._0_8_ = auVar125._0_8_;
                          auVar204._12_4_ = auVar125._12_4_;
                        }
                        else {
                          local_1b68 = (char *)CONCAT44(fVar148,fVar147);
                          auVar146._0_4_ = fVar132 * fVar221 - fVar213 * fVar208;
                          auVar146._4_4_ = fVar151 * fVar224 - fVar214 * fVar209;
                          auVar146._8_4_ = fVar162 * fVar227 - fVar215 * fVar210;
                          auVar146._12_4_ = fVar165 * fVar230 - fVar216 * fVar211;
                          auVar69._4_4_ = -(uint)(ABS(fVar151 * fVar190) < ABS(fVar214 * fVar209));
                          auVar69._0_4_ = -(uint)(ABS(fVar132 * fVar186) < ABS(fVar213 * fVar208));
                          auVar69._8_4_ = -(uint)(ABS(fVar162 * fVar194) < ABS(fVar215 * fVar210));
                          auVar69._12_4_ = -(uint)(ABS(fVar165 * fVar198) < ABS(fVar216 * fVar211));
                          auVar13._4_4_ = fVar109 * fVar209 - fVar151 * fVar190;
                          auVar13._0_4_ = fVar105 * fVar208 - fVar132 * fVar186;
                          auVar13._8_4_ = fVar118 * fVar210 - fVar162 * fVar194;
                          auVar13._12_4_ = fVar121 * fVar211 - fVar165 * fVar198;
                          auVar156 = blendvps(auVar146,auVar13,auVar69);
                          auVar175._0_4_ = fVar199 * fVar208 - fVar107 * fVar221;
                          auVar175._4_4_ = fVar200 * fVar209 - fVar115 * fVar224;
                          auVar175._8_4_ = fVar206 * fVar210 - fVar119 * fVar227;
                          auVar175._12_4_ = fVar207 * fVar211 - fVar123 * fVar230;
                          auVar70._4_4_ = -(uint)(ABS(fVar134 * fVar209) < ABS(fVar115 * fVar224));
                          auVar70._0_4_ = -(uint)(ABS(fVar130 * fVar208) < ABS(fVar107 * fVar221));
                          auVar70._8_4_ = -(uint)(ABS(fVar152 * fVar210) < ABS(fVar119 * fVar227));
                          auVar70._12_4_ = -(uint)(ABS(fVar163 * fVar211) < ABS(fVar123 * fVar230));
                          auVar15._4_4_ = fVar190 * fVar115 - fVar134 * fVar209;
                          auVar15._0_4_ = fVar186 * fVar107 - fVar130 * fVar208;
                          auVar15._8_4_ = fVar194 * fVar119 - fVar152 * fVar210;
                          auVar15._12_4_ = fVar198 * fVar123 - fVar163 * fVar211;
                          auVar81 = blendvps(auVar175,auVar15,auVar70);
                          auVar219._0_4_ = fVar130 * fVar132 - fVar107 * fVar105;
                          auVar219._4_4_ = fVar134 * fVar151 - fVar115 * fVar109;
                          auVar219._8_4_ = fVar152 * fVar162 - fVar119 * fVar118;
                          auVar219._12_4_ = fVar163 * fVar165 - fVar123 * fVar121;
                          auVar159._0_4_ = fVar107 * fVar213 - fVar199 * fVar132;
                          auVar159._4_4_ = fVar115 * fVar214 - fVar200 * fVar151;
                          auVar159._8_4_ = fVar119 * fVar215 - fVar206 * fVar162;
                          auVar159._12_4_ = fVar123 * fVar216 - fVar207 * fVar165;
                          auVar71._4_4_ = -(uint)(ABS(fVar115 * fVar109) < ABS(fVar200 * fVar151));
                          auVar71._0_4_ = -(uint)(ABS(fVar107 * fVar105) < ABS(fVar199 * fVar132));
                          auVar71._8_4_ = -(uint)(ABS(fVar119 * fVar118) < ABS(fVar206 * fVar162));
                          auVar71._12_4_ = -(uint)(ABS(fVar123 * fVar121) < ABS(fVar207 * fVar165));
                          auVar218 = blendvps(auVar159,auVar219,auVar71);
                          fVar168 = fVar131 * auVar156._0_4_ +
                                    local_1c88 * auVar81._0_4_ + local_1ac8 * auVar218._0_4_;
                          fVar176 = fVar140 * auVar156._4_4_ +
                                    fStack_1c84 * auVar81._4_4_ + fStack_1ac4 * auVar218._4_4_;
                          fVar179 = fVar141 * auVar156._8_4_ +
                                    fStack_1c80 * auVar81._8_4_ + fStack_1ac0 * auVar218._8_4_;
                          fVar181 = fVar205 * auVar156._12_4_ +
                                    fStack_1c7c * auVar81._12_4_ + fStack_1abc * auVar218._12_4_;
                          auVar202._0_4_ = fVar168 + fVar168;
                          auVar202._4_4_ = fVar176 + fVar176;
                          auVar202._8_4_ = fVar179 + fVar179;
                          auVar202._12_4_ = fVar181 + fVar181;
                          auVar86._0_4_ = fVar223 * auVar218._0_4_;
                          auVar86._4_4_ = fVar226 * auVar218._4_4_;
                          auVar86._8_4_ = fVar229 * auVar218._8_4_;
                          auVar86._12_4_ = fVar232 * auVar218._12_4_;
                          fVar147 = fVar167 * auVar156._0_4_ +
                                    fVar212 * auVar81._0_4_ + auVar86._0_4_;
                          fVar148 = fVar187 * auVar156._4_4_ +
                                    fVar108 * auVar81._4_4_ + auVar86._4_4_;
                          fVar149 = fVar191 * auVar156._8_4_ +
                                    fVar116 * auVar81._8_4_ + auVar86._8_4_;
                          fVar96 = fVar197 * auVar156._12_4_ +
                                   fVar120 * auVar81._12_4_ + auVar86._12_4_;
                          auVar55 = rcpps(auVar86,auVar202);
                          fVar168 = auVar55._0_4_;
                          fVar176 = auVar55._4_4_;
                          fVar179 = auVar55._8_4_;
                          fVar181 = auVar55._12_4_;
                          fVar168 = ((1.0 - auVar202._0_4_ * fVar168) * fVar168 + fVar168) *
                                    (fVar147 + fVar147);
                          fVar176 = ((1.0 - auVar202._4_4_ * fVar176) * fVar176 + fVar176) *
                                    (fVar148 + fVar148);
                          fVar179 = ((1.0 - auVar202._8_4_ * fVar179) * fVar179 + fVar179) *
                                    (fVar149 + fVar149);
                          fVar181 = ((1.0 - auVar202._12_4_ * fVar181) * fVar181 + fVar181) *
                                    (fVar96 + fVar96);
                          auVar203._0_4_ =
                               (int)((uint)(auVar202._0_4_ != 0.0 &&
                                           (fVar168 <= *(float *)(ray + 0x80) &&
                                           *(float *)(ray + 0x30) <= fVar168)) * -0x80000000) >>
                               0x1f;
                          auVar203._4_4_ =
                               (int)((uint)(auVar202._4_4_ != 0.0 &&
                                           (fVar176 <= *(float *)(ray + 0x84) &&
                                           *(float *)(ray + 0x34) <= fVar176)) * -0x80000000) >>
                               0x1f;
                          auVar203._8_4_ =
                               (int)((uint)(auVar202._8_4_ != 0.0 &&
                                           (fVar179 <= *(float *)(ray + 0x88) &&
                                           *(float *)(ray + 0x38) <= fVar179)) * -0x80000000) >>
                               0x1f;
                          auVar203._12_4_ =
                               (int)((uint)(auVar202._12_4_ != 0.0 &&
                                           (fVar181 <= *(float *)(ray + 0x8c) &&
                                           *(float *)(ray + 0x3c) <= fVar181)) * -0x80000000) >>
                               0x1f;
                          auVar204 = auVar203 & auVar125;
                          iVar28 = movmskps(iVar28,auVar204);
                          if (iVar28 != 0) {
                            local_1778 = local_1c18;
                            uStack_1770 = uStack_1c10;
                            uStack_1c40 = auVar158._8_8_;
                            uStack_1780 = uStack_1c40;
                            local_1798 = local_1b68;
                            p_Stack_1790 = uStack_1b60;
                            local_17d8 = auVar218;
                            local_17c8 = auVar81;
                            local_17b8 = auVar156;
                            local_17a8 = fVar168;
                            fStack_17a4 = fVar176;
                            fStack_17a0 = fVar179;
                            fStack_179c = fVar181;
                            local_1788 = auVar158._0_8_;
                          }
                        }
                        uVar26 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                        pRVar2 = (context->scene->geometries).items;
                        pGVar3 = pRVar2[uVar26].ptr;
                        uVar170 = pGVar3->mask;
                        auVar126._0_4_ = -(uint)((uVar170 & *(uint *)(ray + 0x90)) == 0);
                        auVar126._4_4_ = -(uint)((uVar170 & *(uint *)(ray + 0x94)) == 0);
                        auVar126._8_4_ = -(uint)((uVar170 & *(uint *)(ray + 0x98)) == 0);
                        auVar126._12_4_ = -(uint)((uVar170 & *(uint *)(ray + 0x9c)) == 0);
                        auVar127 = ~auVar126 & auVar204;
                        uVar178 = movmskps((int)pRVar2,auVar127);
                        pRVar37 = (RTCIntersectArguments *)(ulong)uVar178;
                        pRVar34 = (RTCIntersectArguments *)pre.super_Precalculations.grid;
                        if (uVar178 != 0) {
                          uVar178 = *(uint *)(pre.super_Precalculations.grid + 0x1c);
                          pRVar37 = (RTCIntersectArguments *)(ulong)uVar178;
                          pRVar34 = context->args;
                          if ((pRVar34->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar18._8_8_ = p_Stack_1790;
                            auVar18._0_8_ = local_1798;
                            fVar147 = (float)((ulong)local_1798 >> 0x20);
                            fVar148 = (float)((ulong)p_Stack_1790 >> 0x20);
                            auVar55 = rcpps(ZEXT416(uVar170),auVar18);
                            fVar168 = auVar55._0_4_;
                            fVar176 = auVar55._4_4_;
                            fVar179 = auVar55._8_4_;
                            fVar181 = auVar55._12_4_;
                            fVar168 = (float)(-(uint)(1e-18 <= ABS(SUB84(local_1798,0))) &
                                             (uint)(((float)DAT_01f46a60 -
                                                    SUB84(local_1798,0) * fVar168) * fVar168 +
                                                   fVar168));
                            fVar176 = (float)(-(uint)(1e-18 <= ABS(fVar147)) &
                                             (uint)((DAT_01f46a60._4_4_ - fVar147 * fVar176) *
                                                    fVar176 + fVar176));
                            fVar179 = (float)(-(uint)(1e-18 <= ABS(SUB84(p_Stack_1790,0))) &
                                             (uint)((DAT_01f46a60._8_4_ -
                                                    SUB84(p_Stack_1790,0) * fVar179) * fVar179 +
                                                   fVar179));
                            fVar181 = (float)(-(uint)(1e-18 <= ABS(fVar148)) &
                                             (uint)((DAT_01f46a60._12_4_ - fVar148 * fVar181) *
                                                    fVar181 + fVar181));
                            auVar73._0_4_ = (float)local_1778 * fVar168;
                            auVar73._4_4_ = local_1778._4_4_ * fVar176;
                            auVar73._8_4_ = (float)uStack_1770 * fVar179;
                            auVar73._12_4_ = uStack_1770._4_4_ * fVar181;
                            auVar55 = minps(auVar73,_DAT_01f46a60);
                            auVar89._0_4_ = fVar168 * (float)local_1788;
                            auVar89._4_4_ = fVar176 * local_1788._4_4_;
                            auVar89._8_4_ = fVar179 * (float)uStack_1780;
                            auVar89._12_4_ = fVar181 * uStack_1780._4_4_;
                            auVar156 = minps(auVar89,_DAT_01f46a60);
                            uVar170 = *(uint *)(local_1b18 + lVar42 + 0x2c);
                            uVar180 = *(uint *)(local_1b18 + lVar42 + 0x30);
                            auVar113._4_4_ = uVar170;
                            auVar113._0_4_ = uVar170;
                            auVar113._8_4_ = uVar170;
                            auVar113._12_4_ = uVar170;
                            auVar81 = ZEXT816(0);
                            auVar218 = pblendw(auVar113,auVar81,0xaa);
                            fVar53 = (float)DAT_01f76ab0;
                            fVar77 = DAT_01f76ab0._4_4_;
                            fVar79 = DAT_01f76ab0._8_4_;
                            fVar114 = DAT_01f76ab0._12_4_;
                            auVar101._4_4_ = uVar180;
                            auVar101._0_4_ = uVar180;
                            auVar101._8_4_ = uVar180;
                            auVar101._12_4_ = uVar180;
                            fVar168 = auVar55._0_4_;
                            fVar176 = auVar55._4_4_;
                            fVar179 = auVar55._8_4_;
                            fVar181 = auVar55._12_4_;
                            fVar147 = auVar156._0_4_;
                            fVar104 = ((float)DAT_01f46a60 - fVar168) - fVar147;
                            fVar148 = auVar156._4_4_;
                            fVar135 = (DAT_01f46a60._4_4_ - fVar176) - fVar148;
                            fVar149 = auVar156._8_4_;
                            fVar106 = (DAT_01f46a60._8_4_ - fVar179) - fVar149;
                            fVar96 = auVar156._12_4_;
                            fVar78 = (DAT_01f46a60._12_4_ - fVar181) - fVar96;
                            auVar156 = pblendw(auVar101,auVar81,0xaa);
                            uVar183 = *(uint *)(local_1b80 + lVar42);
                            auVar90._4_4_ = uVar183;
                            auVar90._0_4_ = uVar183;
                            auVar90._8_4_ = uVar183;
                            auVar90._12_4_ = uVar183;
                            auVar55 = pblendw(auVar90,auVar81,0xaa);
                            local_19f8 = (float)auVar55._0_4_ * fVar53 * fVar168 +
                                         (float)auVar156._0_4_ * fVar53 * fVar147 +
                                         (float)auVar218._0_4_ * fVar53 * fVar104;
                            fStack_19f4 = (float)auVar55._4_4_ * fVar77 * fVar176 +
                                          (float)auVar156._4_4_ * fVar77 * fVar148 +
                                          (float)auVar218._4_4_ * fVar77 * fVar135;
                            fStack_19f0 = (float)auVar55._8_4_ * fVar79 * fVar179 +
                                          (float)auVar156._8_4_ * fVar79 * fVar149 +
                                          (float)auVar218._8_4_ * fVar79 * fVar106;
                            fStack_19ec = (float)auVar55._12_4_ * fVar114 * fVar181 +
                                          (float)auVar156._12_4_ * fVar114 * fVar96 +
                                          (float)auVar218._12_4_ * fVar114 * fVar78;
                            local_1a48._0_8_ = local_17b8._0_8_;
                            local_1a48._8_8_ = local_17b8._8_8_;
                            local_1a48._16_8_ = local_17c8._0_8_;
                            local_1a48._24_8_ = local_17c8._8_8_;
                            local_1a48._32_8_ = local_17d8._0_8_;
                            local_1a48._40_8_ = local_17d8._8_8_;
                            local_1a18 = CONCAT44(fStack_17a4,local_17a8);
                            uStack_1a10 = CONCAT44(fStack_179c,fStack_17a0);
                            local_1a08 = CONCAT44((float)(uVar183 >> 0x10) * fVar77 * fVar176 +
                                                  (float)(uVar180 >> 0x10) * fVar77 * fVar148 +
                                                  fVar135 * (float)(uVar170 >> 0x10) * fVar77,
                                                  (float)(uVar183 >> 0x10) * fVar53 * fVar168 +
                                                  (float)(uVar180 >> 0x10) * fVar53 * fVar147 +
                                                  fVar104 * (float)(uVar170 >> 0x10) * fVar53);
                            uStack_1a00 = CONCAT44((float)(uVar183 >> 0x10) * fVar114 * fVar181 +
                                                   (float)(uVar180 >> 0x10) * fVar114 * fVar96 +
                                                   fVar78 * (float)(uVar170 >> 0x10) * fVar114,
                                                   (float)(uVar183 >> 0x10) * fVar79 * fVar179 +
                                                   (float)(uVar180 >> 0x10) * fVar79 * fVar149 +
                                                   fVar106 * (float)(uVar170 >> 0x10) * fVar79);
                            args.valid = (int *)&Ng;
                            args.geometryUserPtr = &t;
                            args.context = (RTCRayQueryContext *)&v;
                            args.ray = (RTCRayN *)&u;
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                            ::
                            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                 *)&local_1a48.field_0);
                            local_19e8._4_4_ = uVar26;
                            local_19e8._0_4_ = uVar26;
                            local_19e8._8_4_ = uVar26;
                            local_19e8._12_4_ = uVar26;
                            local_1a48._0_8_ = Ng.field_0._0_8_;
                            local_1a48._8_8_ = Ng.field_0._8_8_;
                            local_1a48._32_8_ = Ng.field_0._32_8_;
                            local_1a48._40_8_ = Ng.field_0._40_8_;
                            local_1a18 = u.field_0._0_8_;
                            uStack_1a10 = u.field_0._8_8_;
                            local_1a08 = v.field_0._0_8_;
                            uStack_1a00 = v.field_0._8_8_;
                            pRVar37 = &local_19d8;
                            local_19d8.flags = context->user->instID[0];
                            local_19d8.filter._0_4_ = context->user->instPrimID[0];
                            auVar55 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar156 = blendvps(auVar55,(undefined1  [16])t.field_0,auVar127);
                            *(undefined1 (*) [16])(ray + 0x80) = auVar156;
                            args.valid = (int *)local_1b38;
                            args.geometryUserPtr = pGVar3->userPtr;
                            args.context = context->user;
                            args.hit = (RTCHitN *)&local_1a48;
                            args.N = 4;
                            pRVar34 = (RTCIntersectArguments *)pGVar3->occlusionFilterN;
                            args.ray = (RTCRayN *)ray;
                            local_1b38 = auVar127;
                            local_19f8 = (float)uVar178;
                            fStack_19f4 = (float)uVar178;
                            fStack_19f0 = (float)uVar178;
                            fStack_19ec = (float)uVar178;
                            local_19d8.feature_mask = local_19d8.flags;
                            local_19d8.context._0_4_ = local_19d8.flags;
                            local_19d8.context._4_4_ = local_19d8.flags;
                            local_19d8.filter._4_4_ = (uint)local_19d8.filter;
                            local_19d8.intersect._0_4_ = (uint)local_19d8.filter;
                            local_19d8.intersect._4_4_ = (uint)local_19d8.filter;
                            if (pRVar34 != (RTCIntersectArguments *)0x0) {
                              pRVar34 = (RTCIntersectArguments *)(*(code *)pRVar34)(&args);
                            }
                            if (local_1b38 == (undefined1  [16])0x0) {
                              auVar93._8_4_ = 0xffffffff;
                              auVar93._0_8_ = 0xffffffffffffffff;
                              auVar93._12_4_ = 0xffffffff;
                              auVar93 = auVar93 ^ _DAT_01f46b70;
                            }
                            else {
                              pRVar37 = context->args;
                              if ((pRVar37->filter != (RTCFilterFunctionN)0x0) &&
                                 (((pRVar37->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                (*pRVar37->filter)(&args);
                              }
                              auVar75._0_4_ = -(uint)(local_1b38._0_4_ == 0);
                              auVar75._4_4_ = -(uint)(local_1b38._4_4_ == 0);
                              auVar75._8_4_ = -(uint)(local_1b38._8_4_ == 0);
                              auVar75._12_4_ = -(uint)(local_1b38._12_4_ == 0);
                              auVar93 = auVar75 ^ _DAT_01f46b70;
                              auVar156 = blendvps(_DAT_01f45a40,
                                                  *(undefined1 (*) [16])(args.ray + 0x80),auVar75);
                              *(undefined1 (*) [16])(args.ray + 0x80) = auVar156;
                              pRVar34 = (RTCIntersectArguments *)args.ray;
                            }
                            auVar94._0_4_ = auVar93._0_4_ << 0x1f;
                            auVar94._4_4_ = auVar93._4_4_ << 0x1f;
                            auVar94._8_4_ = auVar93._8_4_ << 0x1f;
                            auVar94._12_4_ = auVar93._12_4_ << 0x1f;
                            auVar127._0_4_ = auVar94._0_4_ >> 0x1f;
                            auVar127._4_4_ = auVar94._4_4_ >> 0x1f;
                            auVar127._8_4_ = auVar94._8_4_ >> 0x1f;
                            auVar127._12_4_ = auVar94._12_4_ >> 0x1f;
                            auVar55 = blendvps(auVar55,*(undefined1 (*) [16])(ray + 0x80),auVar94);
                            *(undefined1 (*) [16])(ray + 0x80) = auVar55;
                          }
                          _local_1c38 = ~auVar127 & _local_1c38;
                        }
                        fVar181 = INFINITY;
                        fVar179 = INFINITY;
                        fVar176 = INFINITY;
                        fVar168 = INFINITY;
                        iVar28 = movmskps((int)pRVar34,_local_1c38);
                        lVar42 = lVar42 + 4;
                      } while (iVar28 != 0);
                      local_1b18 = local_1b18 + lVar38;
                      local_1ae0 = local_1ae0 + lVar38;
                      local_1ae8 = local_1ae8 + lVar38;
                      local_1af0 = local_1af0 + lVar38;
                      local_1b00 = local_1b00 + lVar38;
                      local_1b08 = local_1b08 + lVar38;
                      local_1af8 = local_1af8 + lVar38;
                      local_1b80 = local_1b80 + lVar38;
                      pGVar45 = pGVar45 + lVar38;
                      local_1a78 = local_1a78 + lVar38;
                      pRVar41 = (RTCIntersectArguments *)(&pRVar41->flags + uVar31);
                      local_1a70 = local_1a70 + lVar38;
                      local_1a80 = local_1a80 + lVar38;
                      pGVar46 = pGVar46 + lVar38;
                    }
                    local_17e8 = auVar63._0_4_;
                    uStack_17e4 = auVar63._4_4_;
                    uStack_17e0 = auVar63._8_4_;
                    uStack_17dc = auVar63._12_4_;
                    auVar95._0_4_ = auVar83._0_4_ ^ local_17e8;
                    auVar95._4_4_ = auVar83._4_4_ ^ uStack_17e4;
                    auVar95._8_4_ = auVar83._8_4_ ^ uStack_17e0;
                    auVar95._12_4_ = auVar83._12_4_ ^ uStack_17dc;
                    local_17f8 = auVar110._0_4_;
                    uStack_17f4 = auVar110._4_4_;
                    uStack_17f0 = auVar110._8_4_;
                    uStack_17ec = auVar110._12_4_;
                    auVar102._0_4_ = auVar99._0_4_ & (local_1c38._0_4_ | local_17f8);
                    auVar102._4_4_ = auVar99._4_4_ & (local_1c38._4_4_ | uStack_17f4);
                    auVar102._8_4_ = auVar99._8_4_ & ((uint)fStack_1c30 | uStack_17f0);
                    auVar102._12_4_ = auVar99._12_4_ & ((uint)fStack_1c2c | uStack_17ec);
                    auVar83 = auVar95;
                    auVar99 = auVar102;
                  }
                  auVar103._0_8_ = auVar99._0_8_ ^ 0xffffffffffffffff;
                  auVar103._8_4_ = auVar99._8_4_ ^ 0xffffffff;
                  auVar103._12_4_ = auVar99._12_4_ ^ 0xffffffff;
                  puVar29 = (undefined1 *)0x0;
                }
                else {
                  pRVar37 = *(RTCIntersectArguments **)(root.ptr & 0xfffffffffffffff0);
                  puVar29 = *(undefined1 **)pRVar37;
                  auVar103._8_8_ = uVar24;
                  auVar103._0_8_ = uVar23;
                  pre.super_Precalculations.grid = (GridSOA *)pRVar37;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     (auVar103 | (undefined1  [16])terminated.field_0);
                uVar26 = movmskps((int)pRVar37,(undefined1  [16])terminated.field_0);
                pRVar37 = (RTCIntersectArguments *)(ulong)uVar26;
                if (uVar26 == 0xf) goto LAB_006d930b;
                aVar82.v = (__m128)blendvps(tray.tfar.field_0,_DAT_01f45a40,
                                            (undefined1  [16])terminated.field_0);
                tray.tfar.field_0 = aVar82;
                if (puVar29 != (undefined1 *)0x0) {
                  local_1b20->ptr = (size_t)puVar29;
                  local_1b20 = local_1b20 + 1;
                  *(undefined8 *)paVar49 = 0xff800000ff800000;
                  *(float *)((long)paVar49 + 8) = -INFINITY;
                  *(float *)((long)paVar49 + 0xc) = -INFINITY;
                  paVar49 = paVar49 + 1;
                }
              }
              goto LAB_006d74bf;
            }
            uVar30 = root.ptr & 0xfffffffffffffff0;
            uVar26 = (uint)root.ptr & 7;
            pRVar37 = (RTCIntersectArguments *)(ulong)uVar26;
            bVar25 = (float)local_1c38._0_4_ < tray.tfar.field_0.v[0];
            bVar8 = (float)local_1c38._4_4_ < tray.tfar.field_0.v[1];
            bVar9 = fStack_1c30 < tray.tfar.field_0.v[2];
            bVar10 = fStack_1c2c < tray.tfar.field_0.v[3];
            aVar82.i[1] = -(uint)bVar8;
            aVar82.i[0] = -(uint)bVar25;
            aVar82.i[2] = -(uint)bVar9;
            aVar82.i[3] = -(uint)bVar10;
            root.ptr = 8;
            local_1c38._0_4_ = fVar168;
            local_1c38._4_4_ = fVar176;
            fStack_1c30 = fVar179;
            fStack_1c2c = fVar181;
            for (; (lVar38 != 0 && (sVar43 = *(size_t *)(uVar30 + 0x20 + lVar38 * 2), sVar43 != 8));
                lVar38 = lVar38 + 4) {
              fVar80 = *(float *)(uVar30 + 0x90 + lVar38);
              fVar169 = *(float *)(uVar30 + 0x30 + lVar38);
              fVar177 = *(float *)(uVar30 + 0x40 + lVar38);
              fVar182 = *(float *)(uVar30 + 0x50 + lVar38);
              fVar142 = *(float *)(uVar30 + 0x60 + lVar38);
              fVar104 = *(float *)(ray + 0x70);
              fVar135 = *(float *)(ray + 0x74);
              fVar106 = *(float *)(ray + 0x78);
              fVar78 = *(float *)(ray + 0x7c);
              fVar122 = *(float *)(uVar30 + 0xb0 + lVar38);
              fVar133 = *(float *)(uVar30 + 0xd0 + lVar38);
              fVar136 = *(float *)(uVar30 + 0x70 + lVar38);
              fVar147 = *(float *)(uVar30 + 0xa0 + lVar38);
              fVar148 = *(float *)(uVar30 + 0xc0 + lVar38);
              fVar149 = *(float *)(uVar30 + 0xe0 + lVar38);
              fVar96 = *(float *)(uVar30 + 0x80 + lVar38);
              fVar205 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
              fVar212 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
              fVar53 = ((fVar80 * fVar104 + fVar169) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar77 = ((fVar80 * fVar135 + fVar169) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar79 = ((fVar80 * fVar106 + fVar169) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar80 = ((fVar80 * fVar78 + fVar169) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar169 = ((fVar122 * fVar104 + fVar182) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar114 = ((fVar122 * fVar135 + fVar182) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar117 = ((fVar122 * fVar106 + fVar182) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar182 = ((fVar122 * fVar78 + fVar182) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar122 = ((fVar133 * fVar104 + fVar136) - (float)tray.org.field_0._32_8_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar129 = ((fVar133 * fVar135 + fVar136) - fVar205) * (float)tray.rdir.field_0._36_4_;
              fVar131 = ((fVar133 * fVar106 + fVar136) - (float)tray.org.field_0._40_8_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar133 = ((fVar133 * fVar78 + fVar136) - fVar212) * (float)tray.rdir.field_0._44_4_;
              fVar136 = ((fVar147 * fVar104 + fVar177) - (float)tray.org.field_0._0_4_) *
                        (float)tray.rdir.field_0._0_4_;
              fVar140 = ((fVar147 * fVar135 + fVar177) - (float)tray.org.field_0._4_4_) *
                        (float)tray.rdir.field_0._4_4_;
              fVar141 = ((fVar147 * fVar106 + fVar177) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar177 = ((fVar147 * fVar78 + fVar177) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar150 = ((fVar148 * fVar104 + fVar142) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar161 = ((fVar148 * fVar135 + fVar142) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar164 = ((fVar148 * fVar106 + fVar142) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar166 = ((fVar148 * fVar78 + fVar142) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar142 = ((fVar149 * fVar104 + fVar96) - (float)tray.org.field_0._32_8_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar147 = ((fVar149 * fVar135 + fVar96) - fVar205) * (float)tray.rdir.field_0._36_4_;
              fVar148 = ((fVar149 * fVar106 + fVar96) - (float)tray.org.field_0._40_8_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar149 = ((fVar149 * fVar78 + fVar96) - fVar212) * (float)tray.rdir.field_0._44_4_;
              uVar170 = (uint)((int)fVar136 < (int)fVar53) * (int)fVar136 |
                        (uint)((int)fVar136 >= (int)fVar53) * (int)fVar53;
              uVar178 = (uint)((int)fVar140 < (int)fVar77) * (int)fVar140 |
                        (uint)((int)fVar140 >= (int)fVar77) * (int)fVar77;
              uVar180 = (uint)((int)fVar141 < (int)fVar79) * (int)fVar141 |
                        (uint)((int)fVar141 >= (int)fVar79) * (int)fVar79;
              uVar183 = (uint)((int)fVar177 < (int)fVar80) * (int)fVar177 |
                        (uint)((int)fVar177 >= (int)fVar80) * (int)fVar80;
              uVar185 = (uint)((int)fVar150 < (int)fVar169) * (int)fVar150 |
                        (uint)((int)fVar150 >= (int)fVar169) * (int)fVar169;
              uVar189 = (uint)((int)fVar161 < (int)fVar114) * (int)fVar161 |
                        (uint)((int)fVar161 >= (int)fVar114) * (int)fVar114;
              uVar193 = (uint)((int)fVar164 < (int)fVar117) * (int)fVar164 |
                        (uint)((int)fVar164 >= (int)fVar117) * (int)fVar117;
              uVar196 = (uint)((int)fVar166 < (int)fVar182) * (int)fVar166 |
                        (uint)((int)fVar166 >= (int)fVar182) * (int)fVar182;
              uVar185 = ((int)uVar185 < (int)uVar170) * uVar170 |
                        ((int)uVar185 >= (int)uVar170) * uVar185;
              uVar189 = ((int)uVar189 < (int)uVar178) * uVar178 |
                        ((int)uVar189 >= (int)uVar178) * uVar189;
              uVar193 = ((int)uVar193 < (int)uVar180) * uVar180 |
                        ((int)uVar193 >= (int)uVar180) * uVar193;
              uVar196 = ((int)uVar196 < (int)uVar183) * uVar183 |
                        ((int)uVar196 >= (int)uVar183) * uVar196;
              uVar170 = (uint)((int)fVar142 < (int)fVar122) * (int)fVar142 |
                        (uint)((int)fVar142 >= (int)fVar122) * (int)fVar122;
              uVar178 = (uint)((int)fVar147 < (int)fVar129) * (int)fVar147 |
                        (uint)((int)fVar147 >= (int)fVar129) * (int)fVar129;
              uVar180 = (uint)((int)fVar148 < (int)fVar131) * (int)fVar148 |
                        (uint)((int)fVar148 >= (int)fVar131) * (int)fVar131;
              uVar183 = (uint)((int)fVar149 < (int)fVar133) * (int)fVar149 |
                        (uint)((int)fVar149 >= (int)fVar133) * (int)fVar133;
              auVar171._0_4_ =
                   ((int)uVar170 < (int)uVar185) * uVar185 |
                   ((int)uVar170 >= (int)uVar185) * uVar170;
              auVar171._4_4_ =
                   ((int)uVar178 < (int)uVar189) * uVar189 |
                   ((int)uVar178 >= (int)uVar189) * uVar178;
              auVar171._8_4_ =
                   ((int)uVar180 < (int)uVar193) * uVar193 |
                   ((int)uVar180 >= (int)uVar193) * uVar180;
              auVar171._12_4_ =
                   ((int)uVar183 < (int)uVar196) * uVar196 |
                   ((int)uVar183 >= (int)uVar196) * uVar183;
              uVar170 = (uint)((int)fVar136 < (int)fVar53) * (int)fVar53 |
                        (uint)((int)fVar136 >= (int)fVar53) * (int)fVar136;
              uVar178 = (uint)((int)fVar140 < (int)fVar77) * (int)fVar77 |
                        (uint)((int)fVar140 >= (int)fVar77) * (int)fVar140;
              uVar180 = (uint)((int)fVar141 < (int)fVar79) * (int)fVar79 |
                        (uint)((int)fVar141 >= (int)fVar79) * (int)fVar141;
              uVar183 = (uint)((int)fVar177 < (int)fVar80) * (int)fVar80 |
                        (uint)((int)fVar177 >= (int)fVar80) * (int)fVar177;
              uVar185 = (uint)((int)fVar150 < (int)fVar169) * (int)fVar169 |
                        (uint)((int)fVar150 >= (int)fVar169) * (int)fVar150;
              uVar189 = (uint)((int)fVar161 < (int)fVar114) * (int)fVar114 |
                        (uint)((int)fVar161 >= (int)fVar114) * (int)fVar161;
              uVar193 = (uint)((int)fVar164 < (int)fVar117) * (int)fVar117 |
                        (uint)((int)fVar164 >= (int)fVar117) * (int)fVar164;
              uVar196 = (uint)((int)fVar166 < (int)fVar182) * (int)fVar182 |
                        (uint)((int)fVar166 >= (int)fVar182) * (int)fVar166;
              uVar185 = ((int)uVar170 < (int)uVar185) * uVar170 |
                        ((int)uVar170 >= (int)uVar185) * uVar185;
              uVar189 = ((int)uVar178 < (int)uVar189) * uVar178 |
                        ((int)uVar178 >= (int)uVar189) * uVar189;
              uVar193 = ((int)uVar180 < (int)uVar193) * uVar180 |
                        ((int)uVar180 >= (int)uVar193) * uVar193;
              uVar196 = ((int)uVar183 < (int)uVar196) * uVar183 |
                        ((int)uVar183 >= (int)uVar196) * uVar196;
              uVar170 = (uint)((int)fVar142 < (int)fVar122) * (int)fVar122 |
                        (uint)((int)fVar142 >= (int)fVar122) * (int)fVar142;
              uVar178 = (uint)((int)fVar147 < (int)fVar129) * (int)fVar129 |
                        (uint)((int)fVar147 >= (int)fVar129) * (int)fVar147;
              uVar180 = (uint)((int)fVar148 < (int)fVar131) * (int)fVar131 |
                        (uint)((int)fVar148 >= (int)fVar131) * (int)fVar148;
              uVar183 = (uint)((int)fVar149 < (int)fVar133) * (int)fVar133 |
                        (uint)((int)fVar149 >= (int)fVar133) * (int)fVar149;
              uVar170 = ((int)uVar185 < (int)uVar170) * uVar185 |
                        ((int)uVar185 >= (int)uVar170) * uVar170;
              uVar178 = ((int)uVar189 < (int)uVar178) * uVar189 |
                        ((int)uVar189 >= (int)uVar178) * uVar178;
              uVar180 = ((int)uVar193 < (int)uVar180) * uVar193 |
                        ((int)uVar193 >= (int)uVar180) * uVar180;
              uVar183 = ((int)uVar196 < (int)uVar183) * uVar196 |
                        ((int)uVar196 >= (int)uVar183) * uVar183;
              bVar4 = (float)((tray.tnear.field_0.i[0] < (int)auVar171._0_4_) * auVar171._0_4_ |
                             (uint)(tray.tnear.field_0.i[0] >= (int)auVar171._0_4_) *
                             tray.tnear.field_0.i[0]) <=
                      (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar170) * tray.tfar.field_0.i[0]
                             | (tray.tfar.field_0.i[0] >= (int)uVar170) * uVar170);
              bVar5 = (float)((tray.tnear.field_0.i[1] < (int)auVar171._4_4_) * auVar171._4_4_ |
                             (uint)(tray.tnear.field_0.i[1] >= (int)auVar171._4_4_) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar178) * tray.tfar.field_0.i[1]
                             | (tray.tfar.field_0.i[1] >= (int)uVar178) * uVar178);
              bVar6 = (float)((tray.tnear.field_0.i[2] < (int)auVar171._8_4_) * auVar171._8_4_ |
                             (uint)(tray.tnear.field_0.i[2] >= (int)auVar171._8_4_) *
                             tray.tnear.field_0.i[2]) <=
                      (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar180) * tray.tfar.field_0.i[2]
                             | (tray.tfar.field_0.i[2] >= (int)uVar180) * uVar180);
              bVar7 = (float)((tray.tnear.field_0.i[3] < (int)auVar171._12_4_) * auVar171._12_4_ |
                             (uint)(tray.tnear.field_0.i[3] >= (int)auVar171._12_4_) *
                             tray.tnear.field_0.i[3]) <=
                      (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar183) * tray.tfar.field_0.i[3]
                             | (tray.tfar.field_0.i[3] >= (int)uVar183) * uVar183);
              if (uVar26 == 6) {
                fVar80 = *(float *)(uVar30 + 0xf0 + lVar38);
                fVar169 = *(float *)(uVar30 + 0x100 + lVar38);
                bVar4 = (fVar104 < fVar169 && fVar80 <= fVar104) && bVar4;
                bVar5 = (fVar135 < fVar169 && fVar80 <= fVar135) && bVar5;
                bVar6 = (fVar106 < fVar169 && fVar80 <= fVar106) && bVar6;
                bVar7 = (fVar78 < fVar169 && fVar80 <= fVar78) && bVar7;
              }
              auVar59._0_4_ = (-(uint)bVar4 & -(uint)bVar25) << 0x1f;
              auVar59._4_4_ = (-(uint)bVar5 & -(uint)bVar8) << 0x1f;
              auVar59._8_4_ = (-(uint)bVar6 & -(uint)bVar9) << 0x1f;
              auVar59._12_4_ = (-(uint)bVar7 & -(uint)bVar10) << 0x1f;
              uVar170 = movmskps((int)valid_i,auVar59);
              valid_i = (vint<4> *)(ulong)uVar170;
              if (uVar170 == 0) {
                auVar98._4_4_ = local_1c38._4_4_;
                auVar98._0_4_ = local_1c38._0_4_;
                auVar98._8_4_ = fStack_1c30;
                auVar98._12_4_ = fStack_1c2c;
                sVar43 = root.ptr;
              }
              else {
                auVar97._4_4_ = fVar176;
                auVar97._0_4_ = fVar168;
                auVar97._8_4_ = fVar179;
                auVar97._12_4_ = fVar181;
                auVar98 = blendvps(auVar97,auVar171,auVar59);
                if (root.ptr != 8) {
                  local_1b20->ptr = root.ptr;
                  local_1b20 = local_1b20 + 1;
                  paVar49->v[0] = (float)local_1c38._0_4_;
                  paVar49->v[1] = (float)local_1c38._4_4_;
                  paVar49->v[2] = fStack_1c30;
                  paVar49->v[3] = fStack_1c2c;
                  paVar49 = paVar49 + 1;
                }
              }
              local_1c38._0_4_ = auVar98._0_4_;
              local_1c38._4_4_ = auVar98._4_4_;
              fStack_1c30 = auVar98._8_4_;
              fStack_1c2c = auVar98._12_4_;
              root.ptr = sVar43;
            }
            if (root.ptr == 8) goto LAB_006d7774;
            auVar60._4_4_ = -(uint)((float)local_1c38._4_4_ < tray.tfar.field_0.v[1]);
            auVar60._0_4_ = -(uint)((float)local_1c38._0_4_ < tray.tfar.field_0.v[0]);
            auVar60._8_4_ = -(uint)(fStack_1c30 < tray.tfar.field_0.v[2]);
            auVar60._12_4_ = -(uint)(fStack_1c2c < tray.tfar.field_0.v[3]);
            uVar27 = movmskps((int)uVar30,auVar60);
            puVar29 = (undefined1 *)(ulong)(uint)POPCOUNT(uVar27);
          } while ((byte)uVar35 < (byte)POPCOUNT(uVar27));
          local_1b20->ptr = root.ptr;
          local_1b20 = local_1b20 + 1;
          paVar49->v[0] = (float)local_1c38._0_4_;
          paVar49->v[1] = (float)local_1c38._4_4_;
          paVar49->v[2] = fStack_1c30;
          paVar49->v[3] = fStack_1c2c;
          paVar49 = paVar49 + 1;
LAB_006d7774:
          puVar29 = (undefined1 *)0x4;
        }
        else {
          while (uVar30 != 0) {
            pRVar41 = (RTCIntersectArguments *)0x0;
            if (uVar30 != 0) {
              for (; (uVar30 >> (long)pRVar41 & 1) == 0;
                  pRVar41 = (RTCIntersectArguments *)((long)&pRVar41->flags + 1)) {
              }
            }
            uVar30 = uVar30 & uVar30 - 1;
            pRVar37 = pRVar41;
            valid_i = (vint<4> *)This;
            bVar25 = occluded1(This,bvh,root,(size_t)pRVar41,&pre,ray,&tray,context);
            if (bVar25) {
              terminated.field_0.i[(long)pRVar41] = -1;
            }
          }
          uVar170 = movmskps((int)pRVar37,(undefined1  [16])terminated.field_0);
          pRVar37 = (RTCIntersectArguments *)(ulong)uVar170;
          puVar29 = (undefined1 *)0x3;
          fVar168 = INFINITY;
          fVar176 = INFINITY;
          fVar179 = INFINITY;
          fVar181 = INFINITY;
          local_1c38._0_4_ = vVar22.field_0._0_4_;
          local_1c38._4_4_ = vVar22.field_0._4_4_;
          fStack_1c30 = vVar22.field_0._8_4_;
          fStack_1c2c = vVar22.field_0._12_4_;
          if (uVar170 != 0xf) {
            aVar82.v = (__m128)blendvps(tray.tfar.field_0,_DAT_01f45a40,
                                        (undefined1  [16])terminated.field_0);
            tray.tfar.field_0 = aVar82;
            puVar29 = (undefined1 *)0x2;
          }
          if (uVar35 < (uint)POPCOUNT(uVar26 & 0xff)) goto LAB_006d7505;
        }
      } while (((int)puVar29 == 4) || ((int)puVar29 == 2));
LAB_006d930b:
      auVar76._0_4_ = uVar184 & terminated.field_0.i[0];
      auVar76._4_4_ = uVar188 & terminated.field_0.i[1];
      auVar76._8_4_ = uVar192 & terminated.field_0.i[2];
      auVar76._12_4_ = uVar195 & terminated.field_0.i[3];
      auVar110 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar76);
      *(undefined1 (*) [16])(ray + 0x80) = auVar110;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }